

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  int iVar101;
  undefined4 uVar102;
  vint4 bi_2;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar135;
  float fVar136;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  vint4 ai;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar147;
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vfloat4 b0_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar185;
  float fVar186;
  vint4 ai_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  __m128 a;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar209;
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar226;
  float fVar227;
  vfloat4 a0_3;
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar242;
  vfloat4 b0_2;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  vfloat4 b0_3;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar29;
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  float fVar137;
  float fVar146;
  undefined1 auVar254 [32];
  
  uVar28 = (ulong)(byte)prim[1];
  lVar31 = uVar28 * 0x25;
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 4 + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 5 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 6 + 6)));
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0xf + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x11 + 6)));
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1a + 6)));
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1b + 6)));
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0x1c + 6)));
  uVar102 = *(undefined4 *)(prim + lVar31 + 0x12);
  auVar255._4_4_ = uVar102;
  auVar255._0_4_ = uVar102;
  auVar255._8_4_ = uVar102;
  auVar255._12_4_ = uVar102;
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar55 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar40 = vsubps_avx512vl(auVar55,*(undefined1 (*) [16])(prim + lVar31 + 6));
  fVar147 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar31 + 0x16)) *
            *(float *)(prim + lVar31 + 0x1a);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar28 * 7 + 6);
  auVar60 = vpmovsxwd_avx(auVar55);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar61 = vpmovsxwd_avx(auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar28 * 9 + 6);
  auVar62 = vpmovsxwd_avx(auVar59);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar28 * 0xd + 6);
  auVar63 = vpmovsxwd_avx(auVar56);
  auVar41 = vpbroadcastd_avx512vl();
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar28 * 0x12 + 6);
  auVar42 = vpmovsxwd_avx512vl(auVar64);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar28 * 0x16 + 6);
  auVar43 = vpmovsxwd_avx512vl(auVar46);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar28 * 0x14 + 6);
  auVar44 = vpmovsxwd_avx512vl(auVar45);
  auVar55 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar55 = vinsertps_avx512f(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar45 = vmulps_avx512vl(auVar255,auVar40);
  auVar46 = vmulps_avx512vl(auVar255,auVar55);
  auVar47 = vcvtdq2ps_avx512vl(auVar47);
  auVar48 = vcvtdq2ps_avx512vl(auVar48);
  auVar49 = vcvtdq2ps_avx512vl(auVar49);
  auVar50 = vcvtdq2ps_avx512vl(auVar50);
  auVar51 = vcvtdq2ps_avx512vl(auVar51);
  auVar267 = ZEXT1664(auVar51);
  auVar55 = vcvtdq2ps_avx(auVar52);
  auVar58 = vcvtdq2ps_avx(auVar53);
  auVar59 = vcvtdq2ps_avx(auVar54);
  auVar56 = vcvtdq2ps_avx(auVar57);
  uVar102 = auVar46._0_4_;
  auVar210._4_4_ = uVar102;
  auVar210._0_4_ = uVar102;
  auVar210._8_4_ = uVar102;
  auVar210._12_4_ = uVar102;
  auVar64 = vshufps_avx(auVar46,auVar46,0x55);
  auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar52 = vmulps_avx512vl(auVar46,auVar49);
  auVar68._0_4_ = auVar46._0_4_ * auVar55._0_4_;
  auVar68._4_4_ = auVar46._4_4_ * auVar55._4_4_;
  auVar68._8_4_ = auVar46._8_4_ * auVar55._8_4_;
  auVar68._12_4_ = auVar46._12_4_ * auVar55._12_4_;
  auVar67._0_4_ = auVar56._0_4_ * auVar46._0_4_;
  auVar67._4_4_ = auVar56._4_4_ * auVar46._4_4_;
  auVar67._8_4_ = auVar56._8_4_ * auVar46._8_4_;
  auVar67._12_4_ = auVar56._12_4_ * auVar46._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar52,auVar64,auVar48);
  auVar52 = vfmadd231ps_avx512vl(auVar68,auVar64,auVar51);
  auVar64 = vfmadd231ps_fma(auVar67,auVar59,auVar64);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar210,auVar47);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar210,auVar50);
  auVar64 = vfmadd231ps_fma(auVar64,auVar58,auVar210);
  auVar53 = vbroadcastss_avx512vl(auVar45);
  auVar54 = vshufps_avx512vl(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx512vl(auVar45,auVar45,0xaa);
  auVar49 = vmulps_avx512vl(auVar45,auVar49);
  auVar55 = vmulps_avx512vl(auVar45,auVar55);
  auVar56 = vmulps_avx512vl(auVar45,auVar56);
  auVar45 = vfmadd231ps_avx512vl(auVar49,auVar54,auVar48);
  auVar48 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar51);
  auVar55 = vfmadd231ps_fma(auVar56,auVar54,auVar59);
  auVar54 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar47);
  auVar57 = vfmadd231ps_avx512vl(auVar48,auVar53,auVar50);
  auVar53 = vfmadd231ps_fma(auVar55,auVar53,auVar58);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar268 = ZEXT1664(auVar55);
  auVar58 = vandps_avx512vl(auVar46,auVar55);
  auVar233._8_4_ = 0x219392ef;
  auVar233._0_8_ = 0x219392ef219392ef;
  auVar233._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar58,auVar233,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  auVar40._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar46._0_4_;
  bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar46._4_4_;
  bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar46._8_4_;
  bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar46._12_4_;
  auVar58 = vandps_avx512vl(auVar52,auVar55);
  uVar34 = vcmpps_avx512vl(auVar58,auVar233,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  auVar65._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar52._0_4_;
  bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar52._4_4_;
  bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar52._8_4_;
  bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar52._12_4_;
  auVar55 = vandps_avx512vl(auVar64,auVar55);
  uVar34 = vcmpps_avx512vl(auVar55,auVar233,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  auVar66._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar64._0_4_;
  bVar35 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar64._4_4_;
  bVar35 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar64._8_4_;
  bVar35 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar64._12_4_;
  auVar55 = vrcp14ps_avx512vl(auVar40);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar269 = ZEXT1664(auVar58);
  auVar59 = vfnmadd213ps_avx512vl(auVar40,auVar55,auVar58);
  auVar59 = vfmadd132ps_fma(auVar59,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar65);
  auVar56 = vfnmadd213ps_avx512vl(auVar65,auVar55,auVar58);
  auVar56 = vfmadd132ps_fma(auVar56,auVar55,auVar55);
  auVar55 = vrcp14ps_avx512vl(auVar66);
  auVar58 = vfnmadd213ps_avx512vl(auVar66,auVar55,auVar58);
  auVar64 = vfmadd132ps_fma(auVar58,auVar55,auVar55);
  auVar138._4_4_ = fVar147;
  auVar138._0_4_ = fVar147;
  auVar138._8_4_ = fVar147;
  auVar138._12_4_ = fVar147;
  auVar55 = vcvtdq2ps_avx(auVar60);
  auVar58 = vcvtdq2ps_avx(auVar61);
  auVar58 = vsubps_avx(auVar58,auVar55);
  auVar46 = vfmadd213ps_fma(auVar58,auVar138,auVar55);
  auVar55 = vcvtdq2ps_avx(auVar62);
  auVar58 = vcvtdq2ps_avx(auVar63);
  auVar58 = vsubps_avx(auVar58,auVar55);
  auVar45 = vfmadd213ps_fma(auVar58,auVar138,auVar55);
  auVar58 = vcvtdq2ps_avx512vl(auVar42);
  auVar55 = vcvtdq2ps_avx512vl(auVar43);
  auVar55 = vsubps_avx(auVar55,auVar58);
  auVar52 = vfmadd213ps_fma(auVar55,auVar138,auVar58);
  auVar58 = vcvtdq2ps_avx512vl(auVar44);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar28 * 0x18 + 6);
  auVar55 = vpmovsxwd_avx(auVar47);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,auVar58);
  auVar47 = vfmadd213ps_fma(auVar55,auVar138,auVar58);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 0x1d + 6);
  auVar55 = vpmovsxwd_avx(auVar48);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar28 * 0x21 + 6);
  auVar58 = vpmovsxwd_avx(auVar49);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,auVar55);
  auVar48 = vfmadd213ps_fma(auVar58,auVar138,auVar55);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar28 * 0x1f + 6);
  auVar55 = vpmovsxwd_avx(auVar50);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar28 * 0x23 + 6);
  auVar58 = vpmovsxwd_avx(auVar51);
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar58 = vsubps_avx(auVar58,auVar55);
  auVar58 = vfmadd213ps_fma(auVar58,auVar138,auVar55);
  auVar55 = vsubps_avx512vl(auVar46,auVar54);
  auVar63._0_4_ = auVar59._0_4_ * auVar55._0_4_;
  auVar63._4_4_ = auVar59._4_4_ * auVar55._4_4_;
  auVar63._8_4_ = auVar59._8_4_ * auVar55._8_4_;
  auVar63._12_4_ = auVar59._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx512vl(auVar45,auVar54);
  auVar62._0_4_ = auVar59._0_4_ * auVar55._0_4_;
  auVar62._4_4_ = auVar59._4_4_ * auVar55._4_4_;
  auVar62._8_4_ = auVar59._8_4_ * auVar55._8_4_;
  auVar62._12_4_ = auVar59._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar52,auVar57);
  auVar43._0_4_ = auVar56._0_4_ * auVar55._0_4_;
  auVar43._4_4_ = auVar56._4_4_ * auVar55._4_4_;
  auVar43._8_4_ = auVar56._8_4_ * auVar55._8_4_;
  auVar43._12_4_ = auVar56._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar47,auVar57);
  auVar61._0_4_ = auVar56._0_4_ * auVar55._0_4_;
  auVar61._4_4_ = auVar56._4_4_ * auVar55._4_4_;
  auVar61._8_4_ = auVar56._8_4_ * auVar55._8_4_;
  auVar61._12_4_ = auVar56._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar48,auVar53);
  auVar44._0_4_ = auVar64._0_4_ * auVar55._0_4_;
  auVar44._4_4_ = auVar64._4_4_ * auVar55._4_4_;
  auVar44._8_4_ = auVar64._8_4_ * auVar55._8_4_;
  auVar44._12_4_ = auVar64._12_4_ * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar58,auVar53);
  auVar60._0_4_ = auVar64._0_4_ * auVar55._0_4_;
  auVar60._4_4_ = auVar64._4_4_ * auVar55._4_4_;
  auVar60._8_4_ = auVar64._8_4_ * auVar55._8_4_;
  auVar60._12_4_ = auVar64._12_4_ * auVar55._12_4_;
  auVar55 = vpminsd_avx(auVar63,auVar62);
  auVar58 = vpminsd_avx(auVar43,auVar61);
  auVar55 = vmaxps_avx(auVar55,auVar58);
  auVar58 = vpminsd_avx(auVar44,auVar60);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar52._4_4_ = uVar102;
  auVar52._0_4_ = uVar102;
  auVar52._8_4_ = uVar102;
  auVar52._12_4_ = uVar102;
  auVar58 = vmaxps_avx512vl(auVar58,auVar52);
  auVar55 = vmaxps_avx(auVar55,auVar58);
  auVar53._8_4_ = 0x3f7ffffa;
  auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar53._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar55,auVar53);
  auVar55 = vpmaxsd_avx(auVar63,auVar62);
  auVar58 = vpmaxsd_avx(auVar43,auVar61);
  auVar55 = vminps_avx(auVar55,auVar58);
  auVar58 = vpmaxsd_avx(auVar44,auVar60);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar54._4_4_ = uVar102;
  auVar54._0_4_ = uVar102;
  auVar54._8_4_ = uVar102;
  auVar54._12_4_ = uVar102;
  auVar58 = vminps_avx512vl(auVar58,auVar54);
  auVar55 = vminps_avx(auVar55,auVar58);
  auVar57._8_4_ = 0x3f800003;
  auVar57._0_8_ = 0x3f8000033f800003;
  auVar57._12_4_ = 0x3f800003;
  auVar55 = vmulps_avx512vl(auVar55,auVar57);
  uVar18 = vcmpps_avx512vl(local_3c0,auVar55,2);
  uVar19 = vpcmpgtd_avx512vl(auVar41,_DAT_01f4ad30);
  uVar34 = CONCAT44((int)((ulong)prim >> 0x20),(uint)((byte)uVar18 & 0xf & (byte)uVar19));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar55 = vpxord_avx512vl(auVar42,auVar42);
  auVar264 = ZEXT1664(auVar55);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar271 = ZEXT1664(auVar55);
LAB_018fb7c0:
  if (uVar34 == 0) {
LAB_018fd712:
    return uVar34 != 0;
  }
  lVar31 = 0;
  for (uVar28 = uVar34; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  fVar147 = (pGVar8->time_range).lower;
  fVar137 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar147) / ((pGVar8->time_range).upper - fVar147));
  auVar55 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
  auVar58 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar55 = vminss_avx(auVar55,auVar58);
  auVar57 = vmaxss_avx512f(auVar264._0_16_,auVar55);
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar31 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar33 = (long)(int)auVar57._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar33);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar33);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar28);
  lVar31 = uVar28 + 1;
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  lVar1 = uVar28 + 2;
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar28 + 3;
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar33);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar33);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar28);
  auVar46 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar47 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar33);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar33);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar28);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  local_1e0 = vpbroadcastd_avx512vl();
  lVar11 = *(long *)(lVar10 + 0x38 + lVar33);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar33);
  auVar52 = *(undefined1 (*) [16])(lVar11 + uVar28 * lVar10);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar31 * lVar10);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar87._16_16_ = local_1e0._16_16_;
  fVar137 = fVar137 - auVar57._0_4_;
  auVar87._0_16_ = vxorps_avx512vl(auVar267._0_16_,auVar267._0_16_);
  auVar57 = vmulps_avx512vl(auVar56,auVar87._0_16_);
  auVar109._8_4_ = 0x3e2aaaab;
  auVar109._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar109._12_4_ = 0x3e2aaaab;
  auVar60 = vfmadd213ps_avx512vl(auVar109,auVar59,auVar57);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar58,auVar61);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar55,auVar109);
  auVar43 = auVar271._0_16_;
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar59,auVar43);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar58,auVar87._0_16_);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar55,auVar43);
  auVar62 = vmulps_avx512vl(auVar47,auVar87._0_16_);
  auVar63 = vfmadd213ps_avx512vl(auVar109,auVar45,auVar62);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar46,auVar61);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar109);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar45,auVar43);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar46,auVar87._0_16_);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar64,auVar43);
  auVar40 = vmulps_avx512vl(auVar56,auVar109);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar59,auVar61);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar58,auVar109);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar55,auVar87._0_16_);
  auVar56 = vmulps_avx512vl(auVar56,auVar43);
  auVar59 = vfmadd231ps_avx512vl(auVar56,auVar87._0_16_,auVar59);
  auVar58 = vfnmadd231ps_avx512vl(auVar59,auVar43,auVar58);
  auVar41 = vfnmadd231ps_avx512vl(auVar58,auVar87._0_16_,auVar55);
  auVar42._0_4_ = auVar47._0_4_ * 0.16666667;
  auVar42._4_4_ = auVar47._4_4_ * 0.16666667;
  auVar42._8_4_ = auVar47._8_4_ * 0.16666667;
  auVar42._12_4_ = auVar47._12_4_ * 0.16666667;
  auVar55 = vfmadd231ps_avx512vl(auVar42,auVar45,auVar61);
  auVar55 = vfmadd231ps_fma(auVar55,auVar46,auVar109);
  auVar42 = vfmadd231ps_avx512vl(auVar55,auVar64,auVar87._0_16_);
  auVar55 = vmulps_avx512vl(auVar47,auVar43);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar87._0_16_,auVar45);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar43,auVar46);
  auVar46 = vfnmadd231ps_avx512vl(auVar55,auVar87._0_16_,auVar64);
  auVar55 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar58 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  fVar124 = auVar57._0_4_;
  auVar148._0_4_ = fVar124 * auVar58._0_4_;
  fVar135 = auVar57._4_4_;
  auVar148._4_4_ = fVar135 * auVar58._4_4_;
  fVar136 = auVar57._8_4_;
  auVar148._8_4_ = fVar136 * auVar58._8_4_;
  fVar228 = auVar57._12_4_;
  auVar148._12_4_ = fVar228 * auVar58._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar148,auVar55,auVar63);
  auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar167._0_4_ = fVar124 * auVar58._0_4_;
  auVar167._4_4_ = fVar135 * auVar58._4_4_;
  auVar167._8_4_ = fVar136 * auVar58._8_4_;
  auVar167._12_4_ = fVar228 * auVar58._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar167,auVar55,auVar62);
  auVar56 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar58 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar231 = auVar41._0_4_;
  auVar188._0_4_ = auVar58._0_4_ * fVar231;
  fVar216 = auVar41._4_4_;
  auVar188._4_4_ = auVar58._4_4_ * fVar216;
  fVar226 = auVar41._8_4_;
  auVar188._8_4_ = auVar58._8_4_ * fVar226;
  fVar227 = auVar41._12_4_;
  auVar188._12_4_ = auVar58._12_4_ * fVar227;
  auVar58 = vfmsub231ps_fma(auVar188,auVar55,auVar42);
  auVar64 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar189._0_4_ = auVar58._0_4_ * fVar231;
  auVar189._4_4_ = auVar58._4_4_ * fVar216;
  auVar189._8_4_ = auVar58._8_4_ * fVar226;
  auVar189._12_4_ = auVar58._12_4_ * fVar227;
  auVar55 = vfmsub231ps_fma(auVar189,auVar55,auVar46);
  auVar46 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar84._4_28_ = auVar87._4_28_;
  auVar84._0_4_ = auVar55._0_4_;
  auVar58 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  auVar45 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  auVar47 = vmulss_avx512f(auVar47,auVar58);
  auVar58 = vmulss_avx512f(auVar47,ZEXT416((uint)(auVar58._0_4_ * auVar58._0_4_)));
  auVar58 = vaddss_avx512f(auVar45,auVar58);
  auVar196._0_4_ = auVar58._0_4_;
  auVar196._4_4_ = auVar196._0_4_;
  auVar196._8_4_ = auVar196._0_4_;
  auVar196._12_4_ = auVar196._0_4_;
  auVar45 = vmulps_avx512vl(auVar59,auVar196);
  auVar58 = vdpps_avx(auVar59,auVar56,0x7f);
  auVar47 = vbroadcastss_avx512vl(auVar55);
  auVar56 = vmulps_avx512vl(auVar47,auVar56);
  fVar147 = auVar58._0_4_;
  auVar149._0_4_ = fVar147 * auVar59._0_4_;
  auVar149._4_4_ = fVar147 * auVar59._4_4_;
  auVar149._8_4_ = fVar147 * auVar59._8_4_;
  auVar149._12_4_ = fVar147 * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar56,auVar149);
  auVar58 = vrcp14ss_avx512f(auVar87._0_16_,auVar84._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar58,ZEXT416(0x40000000));
  fVar146 = auVar58._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar86._16_16_ = auVar87._16_16_;
  auVar86._0_16_ = auVar87._0_16_;
  auVar69._4_28_ = auVar86._4_28_;
  auVar69._0_4_ = auVar55._0_4_;
  auVar58 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar69._0_16_);
  auVar56 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  fVar147 = auVar58._0_4_;
  fVar147 = auVar56._0_4_ + auVar47._0_4_ * fVar147 * fVar147 * fVar147;
  auVar197._0_4_ = fVar147 * auVar64._0_4_;
  auVar197._4_4_ = fVar147 * auVar64._4_4_;
  auVar197._8_4_ = fVar147 * auVar64._8_4_;
  auVar197._12_4_ = fVar147 * auVar64._12_4_;
  auVar58 = vdpps_avx(auVar64,auVar46,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar55);
  auVar56 = vmulps_avx512vl(auVar56,auVar46);
  fVar209 = auVar58._0_4_;
  auVar103._0_4_ = fVar209 * auVar64._0_4_;
  auVar103._4_4_ = fVar209 * auVar64._4_4_;
  auVar103._8_4_ = fVar209 * auVar64._8_4_;
  auVar103._12_4_ = fVar209 * auVar64._12_4_;
  auVar58 = vsubps_avx(auVar56,auVar103);
  auVar56 = vrcp14ss_avx512f(auVar87._0_16_,auVar69._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar56,ZEXT416(0x40000000));
  fVar209 = auVar56._0_4_ * auVar55._0_4_;
  auVar56 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar64 = vmulps_avx512vl(auVar56,auVar45);
  auVar47 = vsubps_avx512vl(auVar60,auVar64);
  auVar55 = vshufps_avx(auVar57,auVar57,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar45);
  auVar139._0_4_ = auVar55._0_4_ + auVar56._0_4_ * auVar196._0_4_ * fVar146 * auVar59._0_4_;
  auVar139._4_4_ = auVar55._4_4_ + auVar56._4_4_ * auVar196._0_4_ * fVar146 * auVar59._4_4_;
  auVar139._8_4_ = auVar55._8_4_ + auVar56._8_4_ * auVar196._0_4_ * fVar146 * auVar59._8_4_;
  auVar139._12_4_ = auVar55._12_4_ + auVar56._12_4_ * auVar196._0_4_ * fVar146 * auVar59._12_4_;
  auVar55 = vsubps_avx(auVar57,auVar139);
  auVar45 = vaddps_avx512vl(auVar60,auVar64);
  auVar59 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar243._0_4_ = auVar197._0_4_ * auVar59._0_4_;
  auVar243._4_4_ = auVar197._4_4_ * auVar59._4_4_;
  auVar243._8_4_ = auVar197._8_4_ * auVar59._8_4_;
  auVar243._12_4_ = auVar197._12_4_ * auVar59._12_4_;
  auVar57 = vsubps_avx512vl(auVar40,auVar243);
  auVar56 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar56 = vmulps_avx512vl(auVar56,auVar197);
  auVar150._0_4_ = auVar56._0_4_ + auVar59._0_4_ * fVar147 * auVar58._0_4_ * fVar209;
  auVar150._4_4_ = auVar56._4_4_ + auVar59._4_4_ * fVar147 * auVar58._4_4_ * fVar209;
  auVar150._8_4_ = auVar56._8_4_ + auVar59._8_4_ * fVar147 * auVar58._8_4_ * fVar209;
  auVar150._12_4_ = auVar56._12_4_ + auVar59._12_4_ * fVar147 * auVar58._12_4_ * fVar209;
  auVar58 = vsubps_avx(auVar41,auVar150);
  auVar60 = vaddps_avx512vl(auVar40,auVar243);
  auVar178._0_4_ = auVar47._0_4_ + auVar55._0_4_ * 0.33333334;
  auVar178._4_4_ = auVar47._4_4_ + auVar55._4_4_ * 0.33333334;
  auVar178._8_4_ = auVar47._8_4_ + auVar55._8_4_ * 0.33333334;
  auVar178._12_4_ = auVar47._12_4_ + auVar55._12_4_ * 0.33333334;
  auVar151._0_4_ = auVar58._0_4_ * 0.33333334;
  auVar151._4_4_ = auVar58._4_4_ * 0.33333334;
  auVar151._8_4_ = auVar58._8_4_ * 0.33333334;
  auVar151._12_4_ = auVar58._12_4_ * 0.33333334;
  auVar64 = vsubps_avx(auVar57,auVar151);
  auVar152._0_4_ = (fVar124 + auVar139._0_4_) * 0.33333334;
  auVar152._4_4_ = (fVar135 + auVar139._4_4_) * 0.33333334;
  auVar152._8_4_ = (fVar136 + auVar139._8_4_) * 0.33333334;
  auVar152._12_4_ = (fVar228 + auVar139._12_4_) * 0.33333334;
  auVar62 = vaddps_avx512vl(auVar45,auVar152);
  auVar168._0_4_ = (fVar231 + auVar150._0_4_) * 0.33333334;
  auVar168._4_4_ = (fVar216 + auVar150._4_4_) * 0.33333334;
  auVar168._8_4_ = (fVar226 + auVar150._8_4_) * 0.33333334;
  auVar168._12_4_ = (fVar227 + auVar150._12_4_) * 0.33333334;
  auVar46 = vsubps_avx(auVar60,auVar168);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar58 = vmulps_avx512vl(auVar51,auVar87._0_16_);
  auVar59 = vfmadd213ps_avx512vl(auVar109,auVar50,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar49,auVar61);
  auVar63 = vfmadd231ps_avx512vl(auVar59,auVar48,auVar109);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar50,auVar43);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar49,auVar87._0_16_);
  auVar40 = vfnmadd231ps_avx512vl(auVar58,auVar48,auVar43);
  auVar58 = vmulps_avx512vl(auVar55,auVar87._0_16_);
  auVar59 = vfmadd213ps_avx512vl(auVar109,auVar54,auVar58);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar53,auVar61);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar52,auVar109);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar43);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar53,auVar87._0_16_);
  auVar56 = vfnmadd231ps_avx512vl(auVar58,auVar52,auVar43);
  auVar58 = vmulps_avx512vl(auVar51,auVar109);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar50,auVar61);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar49,auVar109);
  auVar41 = vfmadd231ps_avx512vl(auVar58,auVar48,auVar87._0_16_);
  auVar58 = vmulps_avx512vl(auVar51,auVar43);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar87._0_16_,auVar50);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar43,auVar49);
  auVar48 = vfnmadd231ps_avx512vl(auVar58,auVar87._0_16_,auVar48);
  auVar58 = vmulps_avx512vl(auVar55,auVar109);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar61);
  auVar58 = vfmadd231ps_fma(auVar58,auVar53,auVar109);
  auVar49 = vfmadd231ps_avx512vl(auVar58,auVar52,auVar87._0_16_);
  auVar55 = vmulps_avx512vl(auVar55,auVar43);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar87._0_16_,auVar54);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar43,auVar53);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar50 = vfnmadd231ps_avx512vl(auVar55,auVar87._0_16_,auVar52);
  auVar55 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar58 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  fVar216 = auVar40._0_4_;
  auVar249._0_4_ = fVar216 * auVar58._0_4_;
  fVar226 = auVar40._4_4_;
  auVar249._4_4_ = fVar226 * auVar58._4_4_;
  fVar227 = auVar40._8_4_;
  auVar249._8_4_ = fVar227 * auVar58._8_4_;
  fVar146 = auVar40._12_4_;
  auVar249._12_4_ = fVar146 * auVar58._12_4_;
  auVar58 = vfmsub231ps_avx512vl(auVar249,auVar55,auVar59);
  auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar256._0_4_ = fVar216 * auVar58._0_4_;
  auVar256._4_4_ = fVar226 * auVar58._4_4_;
  auVar256._8_4_ = fVar227 * auVar58._8_4_;
  auVar256._12_4_ = fVar146 * auVar58._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar256,auVar55,auVar56);
  auVar56 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar58 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar55 = vshufps_avx512vl(auVar49,auVar49,0xc9);
  auVar55 = vmulps_avx512vl(auVar48,auVar55);
  auVar55 = vfmsub231ps_avx512vl(auVar55,auVar58,auVar49);
  auVar49 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar51 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar55 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar51 = vmulps_avx512vl(auVar48,auVar51);
  auVar58 = vfmsub231ps_avx512vl(auVar51,auVar58,auVar50);
  auVar50 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar70._16_16_ = auVar87._16_16_;
  auVar70._0_16_ = auVar87._0_16_;
  auVar71._4_28_ = auVar70._4_28_;
  auVar71._0_4_ = auVar55._0_4_;
  auVar58 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar71._0_16_);
  auVar51 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  auVar52 = vmulss_avx512f(auVar52,auVar58);
  auVar58 = vmulss_avx512f(auVar58,auVar58);
  auVar58 = vmulss_avx512f(auVar52,auVar58);
  auVar58 = vaddss_avx512f(auVar51,auVar58);
  auVar51 = vbroadcastss_avx512vl(auVar58);
  auVar52 = vmulps_avx512vl(auVar59,auVar51);
  auVar58 = vdpps_avx(auVar59,auVar56,0x7f);
  auVar53 = vbroadcastss_avx512vl(auVar55);
  auVar56 = vmulps_avx512vl(auVar53,auVar56);
  fVar147 = auVar58._0_4_;
  auVar153._0_4_ = auVar59._0_4_ * fVar147;
  auVar153._4_4_ = auVar59._4_4_ * fVar147;
  auVar153._8_4_ = auVar59._8_4_ * fVar147;
  auVar153._12_4_ = auVar59._12_4_ * fVar147;
  auVar58 = vsubps_avx(auVar56,auVar153);
  auVar59 = vrcp14ss_avx512f(auVar87._0_16_,auVar71._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar59,ZEXT416(0x40000000));
  fVar147 = auVar59._0_4_ * auVar55._0_4_;
  auVar55 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar110._0_4_ = fVar147 * auVar58._0_4_;
  auVar110._4_4_ = fVar147 * auVar58._4_4_;
  auVar110._8_4_ = fVar147 * auVar58._8_4_;
  auVar110._12_4_ = fVar147 * auVar58._12_4_;
  auVar59 = vmulps_avx512vl(auVar51,auVar110);
  auVar73._16_16_ = auVar87._16_16_;
  auVar73._0_16_ = auVar87._0_16_;
  auVar72._4_28_ = auVar73._4_28_;
  auVar72._0_4_ = auVar55._0_4_;
  auVar58 = vrsqrt14ss_avx512f(auVar87._0_16_,auVar72._0_16_);
  auVar56 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar270 = ZEXT464(0x3f800000);
  auVar51 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
  auVar51 = vmulss_avx512f(auVar51,auVar58);
  auVar58 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar58._0_4_ * auVar58._0_4_)));
  fVar147 = auVar56._0_4_ + auVar58._0_4_;
  auVar257._0_4_ = auVar49._0_4_ * fVar147;
  auVar257._4_4_ = auVar49._4_4_ * fVar147;
  auVar257._8_4_ = auVar49._8_4_ * fVar147;
  auVar257._12_4_ = auVar49._12_4_ * fVar147;
  auVar58 = vdpps_avx(auVar49,auVar50,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar55);
  auVar56 = vmulps_avx512vl(auVar56,auVar50);
  fVar231 = auVar58._0_4_;
  auVar169._0_4_ = auVar49._0_4_ * fVar231;
  auVar169._4_4_ = auVar49._4_4_ * fVar231;
  auVar169._8_4_ = auVar49._8_4_ * fVar231;
  auVar169._12_4_ = auVar49._12_4_ * fVar231;
  auVar58 = vsubps_avx(auVar56,auVar169);
  auVar56 = vrcp14ss_avx512f(auVar87._0_16_,auVar72._0_16_);
  auVar55 = vfnmadd213ss_avx512f(auVar55,auVar56,ZEXT416(0x40000000));
  fVar231 = auVar55._0_4_ * auVar56._0_4_;
  auVar56 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar49 = vmulps_avx512vl(auVar56,auVar52);
  auVar50 = vsubps_avx512vl(auVar63,auVar49);
  auVar55 = vshufps_avx(auVar40,auVar40,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar52);
  auVar111._0_4_ = auVar55._0_4_ + auVar56._0_4_ * auVar59._0_4_;
  auVar111._4_4_ = auVar55._4_4_ + auVar56._4_4_ * auVar59._4_4_;
  auVar111._8_4_ = auVar55._8_4_ + auVar56._8_4_ * auVar59._8_4_;
  auVar111._12_4_ = auVar55._12_4_ + auVar56._12_4_ * auVar59._12_4_;
  auVar55 = vsubps_avx(auVar40,auVar111);
  auVar59 = vaddps_avx512vl(auVar63,auVar49);
  auVar56 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar234._0_4_ = auVar56._0_4_ * auVar257._0_4_;
  auVar234._4_4_ = auVar56._4_4_ * auVar257._4_4_;
  auVar234._8_4_ = auVar56._8_4_ * auVar257._8_4_;
  auVar234._12_4_ = auVar56._12_4_ * auVar257._12_4_;
  auVar49 = vsubps_avx512vl(auVar41,auVar234);
  auVar51 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar51 = vmulps_avx512vl(auVar51,auVar257);
  auVar154._0_4_ = auVar51._0_4_ + auVar56._0_4_ * fVar147 * auVar58._0_4_ * fVar231;
  auVar154._4_4_ = auVar51._4_4_ + auVar56._4_4_ * fVar147 * auVar58._4_4_ * fVar231;
  auVar154._8_4_ = auVar51._8_4_ + auVar56._8_4_ * fVar147 * auVar58._8_4_ * fVar231;
  auVar154._12_4_ = auVar51._12_4_ + auVar56._12_4_ * fVar147 * auVar58._12_4_ * fVar231;
  auVar58 = vsubps_avx(auVar48,auVar154);
  auVar56 = vaddps_avx512vl(auVar41,auVar234);
  auVar170._0_4_ = auVar50._0_4_ + auVar55._0_4_ * 0.33333334;
  auVar170._4_4_ = auVar50._4_4_ + auVar55._4_4_ * 0.33333334;
  auVar170._8_4_ = auVar50._8_4_ + auVar55._8_4_ * 0.33333334;
  auVar170._12_4_ = auVar50._12_4_ + auVar55._12_4_ * 0.33333334;
  auVar198._0_4_ = auVar58._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar58._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar58._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar58._12_4_ * 0.33333334;
  auVar55 = vsubps_avx(auVar49,auVar198);
  auVar112._0_4_ = auVar59._0_4_ + (fVar216 + auVar111._0_4_) * 0.33333334;
  auVar112._4_4_ = auVar59._4_4_ + (fVar226 + auVar111._4_4_) * 0.33333334;
  auVar112._8_4_ = auVar59._8_4_ + (fVar227 + auVar111._8_4_) * 0.33333334;
  auVar112._12_4_ = auVar59._12_4_ + (fVar146 + auVar111._12_4_) * 0.33333334;
  auVar155._0_4_ = (auVar48._0_4_ + auVar154._0_4_) * 0.33333334;
  auVar155._4_4_ = (auVar48._4_4_ + auVar154._4_4_) * 0.33333334;
  auVar155._8_4_ = (auVar48._8_4_ + auVar154._8_4_) * 0.33333334;
  auVar155._12_4_ = (auVar48._12_4_ + auVar154._12_4_) * 0.33333334;
  auVar58 = vsubps_avx(auVar56,auVar155);
  auVar244._4_4_ = fVar137;
  auVar244._0_4_ = fVar137;
  auVar244._8_4_ = fVar137;
  auVar244._12_4_ = fVar137;
  auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar137));
  auVar258._0_4_ = auVar48._0_4_;
  auVar258._4_4_ = auVar258._0_4_;
  auVar258._8_4_ = auVar258._0_4_;
  auVar258._12_4_ = auVar258._0_4_;
  auVar48 = vmulps_avx512vl(auVar244,auVar50);
  auVar50 = vmulps_avx512vl(auVar244,auVar170);
  auVar55 = vmulps_avx512vl(auVar244,auVar55);
  auVar250._0_4_ = fVar137 * auVar49._0_4_;
  auVar250._4_4_ = fVar137 * auVar49._4_4_;
  auVar250._8_4_ = fVar137 * auVar49._8_4_;
  auVar250._12_4_ = fVar137 * auVar49._12_4_;
  local_340 = vfmadd231ps_avx512vl(auVar48,auVar258,auVar47);
  local_350 = vfmadd231ps_avx512vl(auVar50,auVar258,auVar178);
  local_360 = vfmadd231ps_avx512vl(auVar55,auVar258,auVar64);
  local_370 = vfmadd231ps_fma(auVar250,auVar258,auVar57);
  auVar55 = vmulps_avx512vl(auVar244,auVar59);
  auVar59 = vmulps_avx512vl(auVar244,auVar112);
  auVar58 = vmulps_avx512vl(auVar244,auVar58);
  auVar245._0_4_ = fVar137 * auVar56._0_4_;
  auVar245._4_4_ = fVar137 * auVar56._4_4_;
  auVar245._8_4_ = fVar137 * auVar56._8_4_;
  auVar245._12_4_ = fVar137 * auVar56._12_4_;
  _local_380 = vfmadd231ps_avx512vl(auVar55,auVar258,auVar45);
  _local_390 = vfmadd231ps_avx512vl(auVar59,auVar258,auVar62);
  _local_3a0 = vfmadd231ps_avx512vl(auVar58,auVar258,auVar46);
  _local_3b0 = vfmadd231ps_fma(auVar245,auVar258,auVar60);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar55 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_2c0 = vsubps_avx512vl(local_340,auVar55);
  uVar102 = local_2c0._0_4_;
  auVar113._4_4_ = uVar102;
  auVar113._0_4_ = uVar102;
  auVar113._8_4_ = uVar102;
  auVar113._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar59 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar147 = pre->ray_space[k].vz.field_0.m128[0];
  fVar231 = pre->ray_space[k].vz.field_0.m128[1];
  fVar216 = pre->ray_space[k].vz.field_0.m128[2];
  fVar226 = pre->ray_space[k].vz.field_0.m128[3];
  auVar104._0_4_ = fVar147 * auVar59._0_4_;
  auVar104._4_4_ = fVar231 * auVar59._4_4_;
  auVar104._8_4_ = fVar216 * auVar59._8_4_;
  auVar104._12_4_ = fVar226 * auVar59._12_4_;
  auVar58 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar5,auVar58);
  auVar45 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar113);
  local_2d0 = vsubps_avx512vl(local_350,auVar55);
  uVar102 = local_2d0._0_4_;
  auVar125._4_4_ = uVar102;
  auVar125._0_4_ = uVar102;
  auVar125._8_4_ = uVar102;
  auVar125._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar59 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar114._0_4_ = fVar147 * auVar59._0_4_;
  auVar114._4_4_ = fVar231 * auVar59._4_4_;
  auVar114._8_4_ = fVar216 * auVar59._8_4_;
  auVar114._12_4_ = fVar226 * auVar59._12_4_;
  auVar58 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar5,auVar58);
  auVar47 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar125);
  local_2e0 = vsubps_avx512vl(local_360,auVar55);
  uVar102 = local_2e0._0_4_;
  auVar126._4_4_ = uVar102;
  auVar126._0_4_ = uVar102;
  auVar126._8_4_ = uVar102;
  auVar126._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar59 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar190._0_4_ = auVar59._0_4_ * fVar147;
  auVar190._4_4_ = auVar59._4_4_ * fVar231;
  auVar190._8_4_ = auVar59._8_4_ * fVar216;
  auVar190._12_4_ = auVar59._12_4_ * fVar226;
  auVar58 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar58);
  auVar48 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar126);
  local_2f0 = vsubps_avx(local_370,auVar55);
  uVar102 = local_2f0._0_4_;
  auVar127._4_4_ = uVar102;
  auVar127._0_4_ = uVar102;
  auVar127._8_4_ = uVar102;
  auVar127._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar59 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar199._0_4_ = auVar59._0_4_ * fVar147;
  auVar199._4_4_ = auVar59._4_4_ * fVar231;
  auVar199._8_4_ = auVar59._8_4_ * fVar216;
  auVar199._12_4_ = auVar59._12_4_ * fVar226;
  auVar58 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar58);
  auVar49 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar127);
  local_300 = vsubps_avx512vl(_local_380,auVar55);
  uVar102 = local_300._0_4_;
  auVar128._4_4_ = uVar102;
  auVar128._0_4_ = uVar102;
  auVar128._8_4_ = uVar102;
  auVar128._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_300,local_300,0x55);
  auVar59 = vshufps_avx(local_300,local_300,0xaa);
  auVar211._0_4_ = auVar59._0_4_ * fVar147;
  auVar211._4_4_ = auVar59._4_4_ * fVar231;
  auVar211._8_4_ = auVar59._8_4_ * fVar216;
  auVar211._12_4_ = auVar59._12_4_ * fVar226;
  auVar58 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar58);
  auVar50 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar128);
  local_310 = vsubps_avx512vl(_local_390,auVar55);
  uVar102 = local_310._0_4_;
  auVar129._4_4_ = uVar102;
  auVar129._0_4_ = uVar102;
  auVar129._8_4_ = uVar102;
  auVar129._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_310,local_310,0x55);
  auVar59 = vshufps_avx(local_310,local_310,0xaa);
  auVar217._0_4_ = auVar59._0_4_ * fVar147;
  auVar217._4_4_ = auVar59._4_4_ * fVar231;
  auVar217._8_4_ = auVar59._8_4_ * fVar216;
  auVar217._12_4_ = auVar59._12_4_ * fVar226;
  auVar58 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar58);
  auVar51 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar129);
  local_320 = vsubps_avx512vl(_local_3a0,auVar55);
  uVar102 = local_320._0_4_;
  auVar130._4_4_ = uVar102;
  auVar130._0_4_ = uVar102;
  auVar130._8_4_ = uVar102;
  auVar130._12_4_ = uVar102;
  auVar58 = vshufps_avx(local_320,local_320,0x55);
  auVar59 = vshufps_avx(local_320,local_320,0xaa);
  auVar235._0_4_ = auVar59._0_4_ * fVar147;
  auVar235._4_4_ = auVar59._4_4_ * fVar231;
  auVar235._8_4_ = auVar59._8_4_ * fVar216;
  auVar235._12_4_ = auVar59._12_4_ * fVar226;
  auVar58 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar58);
  auVar52 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar4,auVar130);
  local_330 = vsubps_avx(_local_3b0,auVar55);
  uVar102 = local_330._0_4_;
  auVar117._4_4_ = uVar102;
  auVar117._0_4_ = uVar102;
  auVar117._8_4_ = uVar102;
  auVar117._12_4_ = uVar102;
  auVar55 = vshufps_avx(local_330,local_330,0x55);
  auVar58 = vshufps_avx(local_330,local_330,0xaa);
  auVar171._0_4_ = fVar147 * auVar58._0_4_;
  auVar171._4_4_ = fVar231 * auVar58._4_4_;
  auVar171._8_4_ = fVar216 * auVar58._8_4_;
  auVar171._12_4_ = fVar226 * auVar58._12_4_;
  auVar55 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar55);
  auVar53 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar117);
  auVar59 = vmovlhps_avx(auVar45,auVar50);
  auVar56 = vmovlhps_avx(auVar47,auVar51);
  auVar64 = vmovlhps_avx(auVar48,auVar52);
  _local_2a0 = vmovlhps_avx512f(auVar49,auVar53);
  auVar58 = vminps_avx(auVar59,auVar56);
  auVar55 = vmaxps_avx(auVar59,auVar56);
  auVar46 = vminps_avx512vl(auVar64,_local_2a0);
  auVar58 = vminps_avx(auVar58,auVar46);
  auVar46 = vmaxps_avx512vl(auVar64,_local_2a0);
  auVar55 = vmaxps_avx(auVar55,auVar46);
  auVar46 = vshufpd_avx(auVar58,auVar58,3);
  auVar58 = vminps_avx(auVar58,auVar46);
  auVar46 = vshufpd_avx(auVar55,auVar55,3);
  auVar55 = vmaxps_avx(auVar55,auVar46);
  auVar58 = vandps_avx512vl(auVar58,auVar268._0_16_);
  auVar55 = vandps_avx512vl(auVar55,auVar268._0_16_);
  auVar55 = vmaxps_avx(auVar58,auVar55);
  auVar58 = vmovshdup_avx(auVar55);
  auVar55 = vmaxss_avx(auVar58,auVar55);
  fVar147 = auVar55._0_4_ * 9.536743e-07;
  auVar58 = vmovddup_avx512vl(auVar45);
  auVar46 = vmovddup_avx512vl(auVar47);
  auVar191._0_8_ = auVar48._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar200._0_8_ = auVar49._0_8_;
  auVar200._8_8_ = auVar200._0_8_;
  local_2b0 = ZEXT416((uint)fVar147);
  auVar115._4_4_ = fVar147;
  auVar115._0_4_ = fVar147;
  auVar115._8_4_ = fVar147;
  auVar115._12_4_ = fVar147;
  local_260._16_4_ = fVar147;
  local_260._0_16_ = auVar115;
  local_260._20_4_ = fVar147;
  local_260._24_4_ = fVar147;
  local_260._28_4_ = fVar147;
  auVar55 = vxorps_avx512vl(auVar115,auVar54);
  local_1c0 = auVar55._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  bVar35 = false;
  uVar28 = 0;
  fVar147 = *(float *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar56,auVar59);
  local_280 = vsubps_avx(auVar64,auVar56);
  local_290 = vsubps_avx512vl(_local_2a0,auVar64);
  local_3d0 = vsubps_avx512vl(_local_380,local_340);
  local_3e0 = vsubps_avx512vl(_local_390,local_350);
  local_3f0 = vsubps_avx512vl(_local_3a0,local_360);
  _local_400 = vsubps_avx(_local_3b0,local_370);
  local_200 = vpbroadcastd_avx512vl();
  auVar55 = ZEXT816(0x3f80000000000000);
  auVar41 = auVar55;
LAB_018fc319:
  auVar45 = vshufps_avx(auVar41,auVar41,0x50);
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = 0x3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar254._16_4_ = 0x3f800000;
  auVar254._0_16_ = auVar251;
  auVar254._20_4_ = 0x3f800000;
  auVar254._24_4_ = 0x3f800000;
  auVar254._28_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar251,auVar45);
  fVar231 = auVar45._0_4_;
  fVar137 = auVar50._0_4_;
  auVar140._0_4_ = fVar137 * fVar231;
  fVar216 = auVar45._4_4_;
  fVar146 = auVar50._4_4_;
  auVar140._4_4_ = fVar146 * fVar216;
  fVar226 = auVar45._8_4_;
  auVar140._8_4_ = fVar137 * fVar226;
  fVar227 = auVar45._12_4_;
  auVar140._12_4_ = fVar146 * fVar227;
  fVar209 = auVar51._0_4_;
  auVar156._0_4_ = fVar209 * fVar231;
  fVar124 = auVar51._4_4_;
  auVar156._4_4_ = fVar124 * fVar216;
  auVar156._8_4_ = fVar209 * fVar226;
  auVar156._12_4_ = fVar124 * fVar227;
  fVar135 = auVar52._0_4_;
  auVar172._0_4_ = fVar135 * fVar231;
  fVar136 = auVar52._4_4_;
  auVar172._4_4_ = fVar136 * fVar216;
  auVar172._8_4_ = fVar135 * fVar226;
  auVar172._12_4_ = fVar136 * fVar227;
  fVar232 = auVar53._0_4_;
  auVar118._0_4_ = fVar232 * fVar231;
  fVar242 = auVar53._4_4_;
  auVar118._4_4_ = fVar242 * fVar216;
  auVar118._8_4_ = fVar232 * fVar226;
  auVar118._12_4_ = fVar242 * fVar227;
  auVar49 = vfmadd231ps_avx512vl(auVar140,auVar47,auVar58);
  auVar54 = vfmadd231ps_avx512vl(auVar156,auVar47,auVar46);
  auVar48 = vfmadd231ps_fma(auVar172,auVar47,auVar191);
  auVar47 = vfmadd231ps_fma(auVar118,auVar200,auVar47);
  auVar45 = vmovshdup_avx(auVar55);
  fVar216 = auVar55._0_4_;
  fVar231 = (auVar45._0_4_ - fVar216) * 0.04761905;
  auVar143._4_4_ = fVar216;
  auVar143._0_4_ = fVar216;
  auVar143._8_4_ = fVar216;
  auVar143._12_4_ = fVar216;
  auVar143._16_4_ = fVar216;
  auVar143._20_4_ = fVar216;
  auVar143._24_4_ = fVar216;
  auVar143._28_4_ = fVar216;
  auVar79._0_8_ = auVar45._0_8_;
  auVar79._8_8_ = auVar79._0_8_;
  auVar79._16_8_ = auVar79._0_8_;
  auVar79._24_8_ = auVar79._0_8_;
  auVar87 = vsubps_avx(auVar79,auVar143);
  uVar102 = auVar49._0_4_;
  auVar89._4_4_ = uVar102;
  auVar89._0_4_ = uVar102;
  auVar89._8_4_ = uVar102;
  auVar89._12_4_ = uVar102;
  auVar89._16_4_ = uVar102;
  auVar89._20_4_ = uVar102;
  auVar89._24_4_ = uVar102;
  auVar89._28_4_ = uVar102;
  auVar82._8_4_ = 1;
  auVar82._0_8_ = 0x100000001;
  auVar82._12_4_ = 1;
  auVar82._16_4_ = 1;
  auVar82._20_4_ = 1;
  auVar82._24_4_ = 1;
  auVar82._28_4_ = 1;
  auVar86 = ZEXT1632(auVar49);
  auVar84 = vpermps_avx2(auVar82,auVar86);
  auVar69 = vbroadcastss_avx512vl(auVar54);
  auVar85 = ZEXT1632(auVar54);
  auVar70 = vpermps_avx512vl(auVar82,auVar85);
  auVar71 = vbroadcastss_avx512vl(auVar48);
  auVar80 = ZEXT1632(auVar48);
  auVar72 = vpermps_avx512vl(auVar82,auVar80);
  auVar73 = vbroadcastss_avx512vl(auVar47);
  auVar83 = ZEXT1632(auVar47);
  auVar74 = vpermps_avx512vl(auVar82,auVar83);
  auVar214._4_4_ = fVar231;
  auVar214._0_4_ = fVar231;
  auVar214._8_4_ = fVar231;
  auVar214._12_4_ = fVar231;
  auVar214._16_4_ = fVar231;
  auVar214._20_4_ = fVar231;
  auVar214._24_4_ = fVar231;
  auVar214._28_4_ = fVar231;
  auVar81._8_4_ = 2;
  auVar81._0_8_ = 0x200000002;
  auVar81._12_4_ = 2;
  auVar81._16_4_ = 2;
  auVar81._20_4_ = 2;
  auVar81._24_4_ = 2;
  auVar81._28_4_ = 2;
  auVar75 = vpermps_avx512vl(auVar81,auVar86);
  auVar76 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar77 = vpermps_avx512vl(auVar76,auVar86);
  auVar78 = vpermps_avx512vl(auVar81,auVar85);
  auVar79 = vpermps_avx512vl(auVar76,auVar85);
  auVar86 = vpermps_avx2(auVar81,auVar80);
  auVar80 = vpermps_avx512vl(auVar76,auVar80);
  auVar81 = vpermps_avx512vl(auVar81,auVar83);
  auVar82 = vpermps_avx512vl(auVar76,auVar83);
  auVar45 = vfmadd132ps_fma(auVar87,auVar143,_DAT_01f7b040);
  auVar87 = vsubps_avx(auVar254,ZEXT1632(auVar45));
  auVar76 = vmulps_avx512vl(auVar69,ZEXT1632(auVar45));
  auVar85 = ZEXT1632(auVar45);
  auVar83 = vmulps_avx512vl(auVar70,auVar85);
  auVar47 = vfmadd231ps_fma(auVar76,auVar87,auVar89);
  auVar48 = vfmadd231ps_fma(auVar83,auVar87,auVar84);
  auVar76 = vmulps_avx512vl(auVar71,auVar85);
  auVar83 = vmulps_avx512vl(auVar72,auVar85);
  auVar69 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar70);
  auVar76 = vmulps_avx512vl(auVar73,auVar85);
  auVar89 = ZEXT1632(auVar45);
  auVar74 = vmulps_avx512vl(auVar74,auVar89);
  auVar71 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar71);
  auVar72 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar72);
  fVar226 = auVar45._0_4_;
  fVar227 = auVar45._4_4_;
  auVar74._4_4_ = fVar227 * auVar69._4_4_;
  auVar74._0_4_ = fVar226 * auVar69._0_4_;
  fVar228 = auVar45._8_4_;
  auVar74._8_4_ = fVar228 * auVar69._8_4_;
  fVar229 = auVar45._12_4_;
  auVar74._12_4_ = fVar229 * auVar69._12_4_;
  auVar74._16_4_ = auVar69._16_4_ * 0.0;
  auVar74._20_4_ = auVar69._20_4_ * 0.0;
  auVar74._24_4_ = auVar69._24_4_ * 0.0;
  auVar74._28_4_ = fVar216;
  auVar76._4_4_ = fVar227 * auVar70._4_4_;
  auVar76._0_4_ = fVar226 * auVar70._0_4_;
  auVar76._8_4_ = fVar228 * auVar70._8_4_;
  auVar76._12_4_ = fVar229 * auVar70._12_4_;
  auVar76._16_4_ = auVar70._16_4_ * 0.0;
  auVar76._20_4_ = auVar70._20_4_ * 0.0;
  auVar76._24_4_ = auVar70._24_4_ * 0.0;
  auVar76._28_4_ = auVar84._28_4_;
  auVar47 = vfmadd231ps_fma(auVar74,auVar87,ZEXT1632(auVar47));
  auVar48 = vfmadd231ps_fma(auVar76,auVar87,ZEXT1632(auVar48));
  auVar88._0_4_ = fVar226 * auVar71._0_4_;
  auVar88._4_4_ = fVar227 * auVar71._4_4_;
  auVar88._8_4_ = fVar228 * auVar71._8_4_;
  auVar88._12_4_ = fVar229 * auVar71._12_4_;
  auVar88._16_4_ = auVar71._16_4_ * 0.0;
  auVar88._20_4_ = auVar71._20_4_ * 0.0;
  auVar88._24_4_ = auVar71._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar83._4_4_ = fVar227 * auVar72._4_4_;
  auVar83._0_4_ = fVar226 * auVar72._0_4_;
  auVar83._8_4_ = fVar228 * auVar72._8_4_;
  auVar83._12_4_ = fVar229 * auVar72._12_4_;
  auVar83._16_4_ = auVar72._16_4_ * 0.0;
  auVar83._20_4_ = auVar72._20_4_ * 0.0;
  auVar83._24_4_ = auVar72._24_4_ * 0.0;
  auVar83._28_4_ = auVar71._28_4_;
  auVar49 = vfmadd231ps_fma(auVar88,auVar87,auVar69);
  auVar54 = vfmadd231ps_fma(auVar83,auVar87,auVar70);
  auVar85._28_4_ = auVar70._28_4_;
  auVar85._0_28_ =
       ZEXT1628(CONCAT412(fVar229 * auVar54._12_4_,
                          CONCAT48(fVar228 * auVar54._8_4_,
                                   CONCAT44(fVar227 * auVar54._4_4_,fVar226 * auVar54._0_4_))));
  auVar57 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar229 * auVar49._12_4_,
                                               CONCAT48(fVar228 * auVar49._8_4_,
                                                        CONCAT44(fVar227 * auVar49._4_4_,
                                                                 fVar226 * auVar49._0_4_)))),auVar87
                            ,ZEXT1632(auVar47));
  auVar60 = vfmadd231ps_fma(auVar85,auVar87,ZEXT1632(auVar48));
  auVar84 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar47));
  auVar69 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar48));
  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar84 = vmulps_avx512vl(auVar84,auVar70);
  auVar69 = vmulps_avx512vl(auVar69,auVar70);
  auVar163._0_4_ = fVar231 * auVar84._0_4_;
  auVar163._4_4_ = fVar231 * auVar84._4_4_;
  auVar163._8_4_ = fVar231 * auVar84._8_4_;
  auVar163._12_4_ = fVar231 * auVar84._12_4_;
  auVar163._16_4_ = fVar231 * auVar84._16_4_;
  auVar163._20_4_ = fVar231 * auVar84._20_4_;
  auVar163._24_4_ = fVar231 * auVar84._24_4_;
  auVar163._28_4_ = 0;
  auVar84 = vmulps_avx512vl(auVar214,auVar69);
  auVar48 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
  auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar60),_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar123._0_4_ = auVar163._0_4_ + auVar57._0_4_;
  auVar123._4_4_ = auVar163._4_4_ + auVar57._4_4_;
  auVar123._8_4_ = auVar163._8_4_ + auVar57._8_4_;
  auVar123._12_4_ = auVar163._12_4_ + auVar57._12_4_;
  auVar123._16_4_ = auVar163._16_4_ + 0.0;
  auVar123._20_4_ = auVar163._20_4_ + 0.0;
  auVar123._24_4_ = auVar163._24_4_ + 0.0;
  auVar123._28_4_ = 0;
  auVar88 = ZEXT1632(auVar48);
  auVar72 = vpermt2ps_avx512vl(auVar163,_DAT_01fb9fc0,auVar88);
  auVar73 = vaddps_avx512vl(ZEXT1632(auVar60),auVar84);
  auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01fb9fc0,auVar88);
  auVar84 = vsubps_avx(auVar69,auVar72);
  auVar72 = vsubps_avx512vl(auVar71,auVar74);
  auVar74 = vmulps_avx512vl(auVar78,auVar89);
  auVar76 = vmulps_avx512vl(auVar79,auVar89);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar87,auVar75);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar87,auVar77);
  auVar83 = vmulps_avx512vl(auVar86,auVar89);
  auVar85 = vmulps_avx512vl(auVar80,auVar89);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar78);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar79);
  auVar75 = vmulps_avx512vl(auVar81,auVar89);
  auVar77 = vmulps_avx512vl(auVar82,auVar89);
  auVar47 = vfmadd231ps_fma(auVar75,auVar87,auVar86);
  auVar86 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar80);
  auVar75 = vmulps_avx512vl(auVar89,auVar83);
  auVar78 = ZEXT1632(auVar45);
  auVar77 = vmulps_avx512vl(auVar78,auVar85);
  auVar74 = vfmadd231ps_avx512vl(auVar75,auVar87,auVar74);
  auVar76 = vfmadd231ps_avx512vl(auVar77,auVar87,auVar76);
  auVar86 = vmulps_avx512vl(auVar78,auVar86);
  auVar83 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar229 * auVar47._12_4_,
                                          CONCAT48(fVar228 * auVar47._8_4_,
                                                   CONCAT44(fVar227 * auVar47._4_4_,
                                                            fVar226 * auVar47._0_4_)))),auVar87,
                       auVar83);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar87,auVar85);
  auVar75._4_4_ = fVar227 * auVar83._4_4_;
  auVar75._0_4_ = fVar226 * auVar83._0_4_;
  auVar75._8_4_ = fVar228 * auVar83._8_4_;
  auVar75._12_4_ = fVar229 * auVar83._12_4_;
  auVar75._16_4_ = auVar83._16_4_ * 0.0;
  auVar75._20_4_ = auVar83._20_4_ * 0.0;
  auVar75._24_4_ = auVar83._24_4_ * 0.0;
  auVar75._28_4_ = auVar80._28_4_;
  auVar85 = vmulps_avx512vl(auVar78,auVar86);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar87,auVar74);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar76,auVar87);
  auVar87 = vsubps_avx512vl(auVar83,auVar74);
  auVar86 = vsubps_avx512vl(auVar86,auVar76);
  auVar87 = vmulps_avx512vl(auVar87,auVar70);
  auVar86 = vmulps_avx512vl(auVar86,auVar70);
  fVar216 = fVar231 * auVar87._0_4_;
  fVar226 = fVar231 * auVar87._4_4_;
  auVar77._4_4_ = fVar226;
  auVar77._0_4_ = fVar216;
  fVar227 = fVar231 * auVar87._8_4_;
  auVar77._8_4_ = fVar227;
  fVar228 = fVar231 * auVar87._12_4_;
  auVar77._12_4_ = fVar228;
  fVar229 = fVar231 * auVar87._16_4_;
  auVar77._16_4_ = fVar229;
  fVar230 = fVar231 * auVar87._20_4_;
  auVar77._20_4_ = fVar230;
  fVar231 = fVar231 * auVar87._24_4_;
  auVar77._24_4_ = fVar231;
  auVar77._28_4_ = auVar87._28_4_;
  auVar86 = vmulps_avx512vl(auVar214,auVar86);
  auVar70 = vpermt2ps_avx512vl(auVar75,_DAT_01fb9fc0,auVar88);
  auVar74 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,auVar88);
  auVar215._0_4_ = auVar75._0_4_ + fVar216;
  auVar215._4_4_ = auVar75._4_4_ + fVar226;
  auVar215._8_4_ = auVar75._8_4_ + fVar227;
  auVar215._12_4_ = auVar75._12_4_ + fVar228;
  auVar215._16_4_ = auVar75._16_4_ + fVar229;
  auVar215._20_4_ = auVar75._20_4_ + fVar230;
  auVar215._24_4_ = auVar75._24_4_ + fVar231;
  auVar215._28_4_ = auVar75._28_4_ + auVar87._28_4_;
  auVar87 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar76 = vaddps_avx512vl(auVar85,auVar86);
  auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,ZEXT1632(auVar48));
  auVar87 = vsubps_avx(auVar70,auVar87);
  auVar86 = vsubps_avx512vl(auVar74,auVar86);
  auVar143 = ZEXT1632(auVar57);
  auVar83 = vsubps_avx512vl(auVar75,auVar143);
  auVar163 = ZEXT1632(auVar60);
  auVar77 = vsubps_avx512vl(auVar85,auVar163);
  auVar78 = vsubps_avx512vl(auVar70,auVar69);
  auVar83 = vaddps_avx512vl(auVar83,auVar78);
  auVar78 = vsubps_avx512vl(auVar74,auVar71);
  auVar77 = vaddps_avx512vl(auVar77,auVar78);
  auVar78 = vmulps_avx512vl(auVar163,auVar83);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar143,auVar77);
  auVar79 = vmulps_avx512vl(auVar73,auVar83);
  auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar123,auVar77);
  auVar80 = vmulps_avx512vl(auVar72,auVar83);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar84,auVar77);
  auVar81 = vmulps_avx512vl(auVar71,auVar83);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar69,auVar77);
  auVar82 = vmulps_avx512vl(auVar85,auVar83);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar75,auVar77);
  auVar88 = vmulps_avx512vl(auVar76,auVar83);
  auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar215,auVar77);
  auVar89 = vmulps_avx512vl(auVar86,auVar83);
  auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar77);
  auVar83 = vmulps_avx512vl(auVar74,auVar83);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar70,auVar77);
  auVar77 = vminps_avx512vl(auVar78,auVar79);
  auVar78 = vmaxps_avx512vl(auVar78,auVar79);
  auVar79 = vminps_avx512vl(auVar80,auVar81);
  auVar77 = vminps_avx512vl(auVar77,auVar79);
  auVar79 = vmaxps_avx512vl(auVar80,auVar81);
  auVar78 = vmaxps_avx512vl(auVar78,auVar79);
  auVar79 = vminps_avx512vl(auVar82,auVar88);
  auVar80 = vmaxps_avx512vl(auVar82,auVar88);
  auVar81 = vminps_avx512vl(auVar89,auVar83);
  auVar79 = vminps_avx512vl(auVar79,auVar81);
  auVar77 = vminps_avx512vl(auVar77,auVar79);
  auVar83 = vmaxps_avx512vl(auVar89,auVar83);
  auVar83 = vmaxps_avx512vl(auVar80,auVar83);
  auVar83 = vmaxps_avx512vl(auVar78,auVar83);
  auVar45 = auVar83._0_16_;
  uVar18 = vcmpps_avx512vl(auVar77,local_260,2);
  auVar78._4_4_ = uStack_1bc;
  auVar78._0_4_ = local_1c0;
  auVar78._8_4_ = uStack_1b8;
  auVar78._12_4_ = uStack_1b4;
  auVar78._16_4_ = uStack_1b0;
  auVar78._20_4_ = uStack_1ac;
  auVar78._24_4_ = uStack_1a8;
  auVar78._28_4_ = uStack_1a4;
  uVar19 = vcmpps_avx512vl(auVar83,auVar78,5);
  bVar26 = (byte)uVar18 & (byte)uVar19 & 0x7f;
  if (bVar26 != 0) {
    auVar83 = vsubps_avx512vl(auVar69,auVar143);
    auVar77 = vsubps_avx512vl(auVar71,auVar163);
    auVar79 = vsubps_avx512vl(auVar70,auVar75);
    auVar83 = vaddps_avx512vl(auVar83,auVar79);
    auVar45 = auVar83._0_16_;
    auVar79 = vsubps_avx512vl(auVar74,auVar85);
    auVar77 = vaddps_avx512vl(auVar77,auVar79);
    auVar79 = vmulps_avx512vl(auVar163,auVar83);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar77,auVar143);
    auVar73 = vmulps_avx512vl(auVar73,auVar83);
    auVar73 = vfnmadd213ps_avx512vl(auVar123,auVar77,auVar73);
    auVar72 = vmulps_avx512vl(auVar72,auVar83);
    auVar72 = vfnmadd213ps_avx512vl(auVar84,auVar77,auVar72);
    auVar84 = vmulps_avx512vl(auVar71,auVar83);
    auVar71 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar69);
    auVar84 = vmulps_avx512vl(auVar85,auVar83);
    auVar85 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar75);
    auVar84 = vmulps_avx512vl(auVar76,auVar83);
    auVar76 = vfnmadd213ps_avx512vl(auVar215,auVar77,auVar84);
    auVar84 = vmulps_avx512vl(auVar86,auVar83);
    auVar75 = vfnmadd213ps_avx512vl(auVar87,auVar77,auVar84);
    auVar87 = vmulps_avx512vl(auVar74,auVar83);
    auVar74 = vfnmadd231ps_avx512vl(auVar87,auVar70,auVar77);
    auVar84 = vminps_avx(auVar79,auVar73);
    auVar87 = vmaxps_avx(auVar79,auVar73);
    auVar69 = vminps_avx(auVar72,auVar71);
    auVar69 = vminps_avx(auVar84,auVar69);
    auVar84 = vmaxps_avx(auVar72,auVar71);
    auVar87 = vmaxps_avx(auVar87,auVar84);
    auVar86 = vminps_avx(auVar85,auVar76);
    auVar84 = vmaxps_avx(auVar85,auVar76);
    auVar70 = vminps_avx(auVar75,auVar74);
    auVar86 = vminps_avx(auVar86,auVar70);
    auVar86 = vminps_avx(auVar69,auVar86);
    auVar69 = vmaxps_avx(auVar75,auVar74);
    auVar84 = vmaxps_avx(auVar84,auVar69);
    auVar87 = vmaxps_avx(auVar87,auVar84);
    uVar18 = vcmpps_avx512vl(auVar87,auVar78,5);
    uVar19 = vcmpps_avx512vl(auVar86,local_260,2);
    bVar26 = bVar26 & (byte)uVar18 & (byte)uVar19;
    if (bVar26 != 0) {
      auStack_460[uVar28] = (uint)bVar26;
      uVar18 = vmovlps_avx(auVar55);
      (&uStack_240)[uVar28] = uVar18;
      uVar3 = vmovlps_avx(auVar41);
      auStack_1a0[uVar28] = uVar3;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
  }
  auVar55 = vxorps_avx512vl(auVar45,auVar45);
  auVar264 = ZEXT1664(auVar55);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar271 = ZEXT1664(auVar55);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar265 = ZEXT3264(auVar87);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar266 = ZEXT1664(auVar55);
  auVar267 = ZEXT3264(_DAT_01fb9fe0);
LAB_018fc815:
  do {
    do {
      do {
        auVar47 = auVar269._0_16_;
        auVar45 = auVar264._0_16_;
        if ((int)uVar28 == 0) {
          if (bVar35) goto LAB_018fd712;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar25._4_4_ = uVar102;
          auVar25._0_4_ = uVar102;
          auVar25._8_4_ = uVar102;
          auVar25._12_4_ = uVar102;
          uVar18 = vcmpps_avx512vl(local_3c0,auVar25,2);
          uVar34 = (ulong)((uint)uVar34 & (uint)uVar34 + 0xf & (uint)uVar18);
          goto LAB_018fb7c0;
        }
        uVar27 = (int)uVar28 - 1;
        uVar29 = (ulong)uVar27;
        uVar7 = auStack_460[uVar29];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auStack_1a0[uVar29];
        uVar3 = 0;
        for (uVar32 = (ulong)uVar7; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar3 = uVar3 + 1;
        }
        uVar30 = uVar7 - 1 & uVar7;
        bVar38 = uVar30 == 0;
        auStack_460[uVar29] = uVar30;
        if (bVar38) {
          uVar28 = (ulong)uVar27;
        }
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar3;
        auVar55 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar3 + 1));
        auVar55 = vcvtqq2ps_avx512vl(auVar55);
        auVar55 = vmulps_avx512vl(auVar55,auVar266._0_16_);
        uVar102 = *(undefined4 *)((long)&uStack_240 + uVar29 * 8 + 4);
        auVar20._4_4_ = uVar102;
        auVar20._0_4_ = uVar102;
        auVar20._8_4_ = uVar102;
        auVar20._12_4_ = uVar102;
        auVar48 = vmulps_avx512vl(auVar55,auVar20);
        auVar55 = vsubps_avx512vl(auVar47,auVar55);
        uVar102 = *(undefined4 *)(&uStack_240 + uVar29);
        auVar21._4_4_ = uVar102;
        auVar21._0_4_ = uVar102;
        auVar21._8_4_ = uVar102;
        auVar21._12_4_ = uVar102;
        auVar55 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar21);
        auVar48 = vmovshdup_avx(auVar55);
        fVar231 = auVar48._0_4_ - auVar55._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar231));
        if (uVar7 == 0 || bVar38) goto LAB_018fc319;
        auVar48 = vshufps_avx(auVar41,auVar41,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar231));
        auVar57 = vsubps_avx512vl(auVar47,auVar48);
        fVar216 = auVar48._0_4_;
        auVar157._0_4_ = fVar216 * fVar137;
        fVar226 = auVar48._4_4_;
        auVar157._4_4_ = fVar226 * fVar146;
        fVar227 = auVar48._8_4_;
        auVar157._8_4_ = fVar227 * fVar137;
        fVar228 = auVar48._12_4_;
        auVar157._12_4_ = fVar228 * fVar146;
        auVar173._0_4_ = fVar216 * fVar209;
        auVar173._4_4_ = fVar226 * fVar124;
        auVar173._8_4_ = fVar227 * fVar209;
        auVar173._12_4_ = fVar228 * fVar124;
        auVar179._0_4_ = fVar216 * fVar135;
        auVar179._4_4_ = fVar226 * fVar136;
        auVar179._8_4_ = fVar227 * fVar135;
        auVar179._12_4_ = fVar228 * fVar136;
        auVar131._0_4_ = fVar216 * fVar232;
        auVar131._4_4_ = fVar226 * fVar242;
        auVar131._8_4_ = fVar227 * fVar232;
        auVar131._12_4_ = fVar228 * fVar242;
        auVar48 = vfmadd231ps_fma(auVar157,auVar57,auVar58);
        auVar49 = vfmadd231ps_fma(auVar173,auVar57,auVar46);
        auVar54 = vfmadd231ps_fma(auVar179,auVar57,auVar191);
        auVar57 = vfmadd231ps_fma(auVar131,auVar57,auVar200);
        auVar144._16_16_ = auVar48;
        auVar144._0_16_ = auVar48;
        auVar164._16_16_ = auVar49;
        auVar164._0_16_ = auVar49;
        auVar177._16_16_ = auVar54;
        auVar177._0_16_ = auVar54;
        auVar84 = vpermps_avx512vl(auVar267._0_32_,ZEXT1632(auVar55));
        auVar87 = vsubps_avx(auVar164,auVar144);
        auVar49 = vfmadd213ps_fma(auVar87,auVar84,auVar144);
        auVar87 = vsubps_avx(auVar177,auVar164);
        auVar60 = vfmadd213ps_fma(auVar87,auVar84,auVar164);
        auVar48 = vsubps_avx(auVar57,auVar54);
        auVar165._16_16_ = auVar48;
        auVar165._0_16_ = auVar48;
        auVar48 = vfmadd213ps_fma(auVar165,auVar84,auVar177);
        auVar87 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar49));
        auVar49 = vfmadd213ps_fma(auVar87,auVar84,ZEXT1632(auVar49));
        auVar87 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar60));
        auVar48 = vfmadd213ps_fma(auVar87,auVar84,ZEXT1632(auVar60));
        auVar87 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar49));
        auVar44 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar87,auVar84);
        auVar87 = vmulps_avx512vl(auVar87,auVar265._0_32_);
        auVar80._16_16_ = auVar87._16_16_;
        auVar48 = vmulss_avx512f(ZEXT416((uint)fVar231),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar216 = auVar48._0_4_;
        auVar180._0_8_ =
             CONCAT44(auVar44._4_4_ + fVar216 * auVar87._4_4_,
                      auVar44._0_4_ + fVar216 * auVar87._0_4_);
        auVar180._8_4_ = auVar44._8_4_ + fVar216 * auVar87._8_4_;
        auVar180._12_4_ = auVar44._12_4_ + fVar216 * auVar87._12_4_;
        auVar158._0_4_ = fVar216 * auVar87._16_4_;
        auVar158._4_4_ = fVar216 * auVar87._20_4_;
        auVar158._8_4_ = fVar216 * auVar87._24_4_;
        auVar158._12_4_ = fVar216 * auVar87._28_4_;
        auVar40 = vsubps_avx((undefined1  [16])0x0,auVar158);
        auVar60 = vshufpd_avx(auVar44,auVar44,3);
        auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar48 = vsubps_avx(auVar60,auVar44);
        auVar49 = vsubps_avx(auVar61,(undefined1  [16])0x0);
        auVar201._0_4_ = auVar48._0_4_ + auVar49._0_4_;
        auVar201._4_4_ = auVar48._4_4_ + auVar49._4_4_;
        auVar201._8_4_ = auVar48._8_4_ + auVar49._8_4_;
        auVar201._12_4_ = auVar48._12_4_ + auVar49._12_4_;
        auVar48 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar49 = vshufps_avx(auVar180,auVar180,0xb1);
        auVar54 = vshufps_avx(auVar40,auVar40,0xb1);
        auVar57 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar252._4_4_ = auVar201._0_4_;
        auVar252._0_4_ = auVar201._0_4_;
        auVar252._8_4_ = auVar201._0_4_;
        auVar252._12_4_ = auVar201._0_4_;
        auVar62 = vshufps_avx(auVar201,auVar201,0x55);
        fVar216 = auVar62._0_4_;
        auVar212._0_4_ = auVar48._0_4_ * fVar216;
        fVar226 = auVar62._4_4_;
        auVar212._4_4_ = auVar48._4_4_ * fVar226;
        fVar227 = auVar62._8_4_;
        auVar212._8_4_ = auVar48._8_4_ * fVar227;
        fVar228 = auVar62._12_4_;
        auVar212._12_4_ = auVar48._12_4_ * fVar228;
        auVar218._0_4_ = auVar49._0_4_ * fVar216;
        auVar218._4_4_ = auVar49._4_4_ * fVar226;
        auVar218._8_4_ = auVar49._8_4_ * fVar227;
        auVar218._12_4_ = auVar49._12_4_ * fVar228;
        auVar236._0_4_ = auVar54._0_4_ * fVar216;
        auVar236._4_4_ = auVar54._4_4_ * fVar226;
        auVar236._8_4_ = auVar54._8_4_ * fVar227;
        auVar236._12_4_ = auVar54._12_4_ * fVar228;
        auVar202._0_4_ = auVar57._0_4_ * fVar216;
        auVar202._4_4_ = auVar57._4_4_ * fVar226;
        auVar202._8_4_ = auVar57._8_4_ * fVar227;
        auVar202._12_4_ = auVar57._12_4_ * fVar228;
        auVar48 = vfmadd231ps_fma(auVar212,auVar252,auVar44);
        auVar49 = vfmadd231ps_fma(auVar218,auVar252,auVar180);
        auVar42 = vfmadd231ps_fma(auVar236,auVar252,auVar40);
        auVar43 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar252);
        auVar62 = vshufpd_avx(auVar48,auVar48,1);
        auVar63 = vshufpd_avx(auVar49,auVar49,1);
        auVar65 = vshufpd_avx512vl(auVar42,auVar42,1);
        auVar66 = vshufpd_avx512vl(auVar43,auVar43,1);
        auVar54 = vminss_avx(auVar48,auVar49);
        auVar48 = vmaxss_avx(auVar49,auVar48);
        auVar57 = vminss_avx(auVar42,auVar43);
        auVar49 = vmaxss_avx(auVar43,auVar42);
        auVar54 = vminss_avx(auVar54,auVar57);
        auVar48 = vmaxss_avx(auVar49,auVar48);
        auVar57 = vminss_avx(auVar62,auVar63);
        auVar49 = vmaxss_avx(auVar63,auVar62);
        auVar62 = vminss_avx512f(auVar65,auVar66);
        auVar63 = vmaxss_avx512f(auVar66,auVar65);
        auVar49 = vmaxss_avx(auVar63,auVar49);
        auVar57 = vminss_avx512f(auVar57,auVar62);
        vucomiss_avx512f(auVar54);
        fVar226 = auVar49._0_4_;
        fVar216 = auVar48._0_4_;
        if (4 < (uint)uVar28) {
          bVar39 = fVar226 == -0.0001;
          bVar36 = NAN(fVar226);
          if (fVar226 <= -0.0001) goto LAB_018fca43;
          break;
        }
LAB_018fca43:
        auVar62 = vucomiss_avx512f(auVar57);
        bVar39 = fVar226 <= -0.0001;
        bVar37 = -0.0001 < fVar216;
        bVar36 = bVar39;
        if (!bVar39) break;
        uVar18 = vcmpps_avx512vl(auVar54,auVar62,5);
        uVar19 = vcmpps_avx512vl(auVar57,auVar62,5);
        bVar26 = (byte)uVar18 & (byte)uVar19 & 1;
        bVar39 = bVar37 && bVar26 == 0;
        bVar36 = bVar37 && bVar26 == 0;
      } while (!bVar37 || bVar26 != 0);
      vcmpss_avx512f(auVar54,auVar45,1);
      auVar42 = auVar270._0_16_;
      uVar18 = vcmpss_avx512f(auVar48,auVar45,1);
      bVar37 = (bool)((byte)uVar18 & 1);
      auVar80._0_16_ = auVar42;
      iVar101 = auVar270._0_4_;
      auVar90._4_28_ = auVar80._4_28_;
      auVar90._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * iVar101);
      vucomiss_avx512f(auVar90._0_16_);
      bVar36 = (bool)(!bVar39 | bVar36);
      bVar37 = bVar36 == false;
      auVar92._16_16_ = auVar80._16_16_;
      auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar36 * auVar264._0_4_ + (uint)!bVar36 * 0x7f800000;
      auVar63 = auVar91._0_16_;
      auVar94._16_16_ = auVar80._16_16_;
      auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar36 * auVar264._0_4_ + (uint)!bVar36 * -0x800000;
      auVar62 = auVar93._0_16_;
      uVar18 = vcmpss_avx512f(auVar57,auVar45,1);
      bVar39 = (bool)((byte)uVar18 & 1);
      auVar96._16_16_ = auVar80._16_16_;
      auVar96._0_16_ = auVar42;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar101);
      vucomiss_avx512f(auVar95._0_16_);
      if ((bVar36) || (bVar37)) {
        auVar57 = vucomiss_avx512f(auVar54);
        if ((bVar36) || (bVar37)) {
          auVar24._8_4_ = 0x80000000;
          auVar24._0_8_ = 0x8000000080000000;
          auVar24._12_4_ = 0x80000000;
          auVar43 = vxorps_avx512vl(auVar54,auVar24);
          auVar54 = vsubss_avx512f(auVar57,auVar54);
          auVar54 = vdivss_avx512f(auVar43,auVar54);
          auVar57 = vsubss_avx512f(auVar42,auVar54);
          auVar54 = vfmadd213ss_avx512f(auVar57,auVar45,auVar54);
          auVar57 = auVar54;
        }
        else {
          auVar57 = vxorps_avx512vl(auVar57,auVar57);
          vucomiss_avx512f(auVar57);
          if ((bVar36) || (auVar54 = auVar42, bVar37)) {
            auVar54 = SUB6416(ZEXT464(0xff800000),0);
            auVar57 = ZEXT416(0x7f800000);
          }
        }
        auVar63 = vminss_avx512f(auVar63,auVar57);
        auVar62 = vmaxss_avx(auVar54,auVar62);
      }
      uVar18 = vcmpss_avx512f(auVar49,auVar45,1);
      bVar39 = (bool)((byte)uVar18 & 1);
      fVar227 = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * iVar101);
      if ((auVar90._0_4_ != fVar227) || (NAN(auVar90._0_4_) || NAN(fVar227))) {
        if ((fVar226 != fVar216) || (NAN(fVar226) || NAN(fVar216))) {
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar48 = vxorps_avx512vl(auVar48,auVar23);
          auVar203._0_4_ = auVar48._0_4_ / (fVar226 - fVar216);
          auVar203._4_12_ = auVar48._4_12_;
          auVar48 = vsubss_avx512f(auVar42,auVar203);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar45,auVar203);
          auVar49 = auVar48;
        }
        else if ((fVar216 != 0.0) ||
                (auVar48 = auVar42, auVar49 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar216))) {
          auVar48 = SUB6416(ZEXT464(0xff800000),0);
          auVar49 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar63 = vminss_avx(auVar63,auVar49);
        auVar62 = vmaxss_avx(auVar48,auVar62);
      }
      bVar39 = auVar95._0_4_ != fVar227;
      auVar48 = vminss_avx512f(auVar63,auVar42);
      auVar98._16_16_ = auVar80._16_16_;
      auVar98._0_16_ = auVar63;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar63._0_4_;
      auVar48 = vmaxss_avx512f(auVar42,auVar62);
      auVar100._16_16_ = auVar80._16_16_;
      auVar100._0_16_ = auVar62;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (uint)bVar39 * auVar48._0_4_ + (uint)!bVar39 * auVar62._0_4_;
      auVar48 = vmaxss_avx512f(auVar45,auVar97._0_16_);
      auVar49 = vminss_avx512f(auVar99._0_16_,auVar42);
    } while (auVar49._0_4_ < auVar48._0_4_);
    auVar57 = vmaxss_avx512f(auVar45,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
    auVar43 = vminss_avx512f(ZEXT416((uint)(auVar49._0_4_ + 0.1)),auVar42);
    auVar132._0_8_ = auVar44._0_8_;
    auVar132._8_8_ = auVar132._0_8_;
    auVar219._8_8_ = auVar180._0_8_;
    auVar219._0_8_ = auVar180._0_8_;
    auVar237._8_8_ = auVar40._0_8_;
    auVar237._0_8_ = auVar40._0_8_;
    auVar48 = vshufpd_avx(auVar180,auVar180,3);
    auVar49 = vshufpd_avx(auVar40,auVar40,3);
    auVar54 = vshufps_avx(auVar57,auVar43,0);
    auVar63 = vsubps_avx512vl(auVar47,auVar54);
    fVar216 = auVar54._0_4_;
    auVar174._0_4_ = fVar216 * auVar60._0_4_;
    fVar226 = auVar54._4_4_;
    auVar174._4_4_ = fVar226 * auVar60._4_4_;
    fVar227 = auVar54._8_4_;
    auVar174._8_4_ = fVar227 * auVar60._8_4_;
    fVar228 = auVar54._12_4_;
    auVar174._12_4_ = fVar228 * auVar60._12_4_;
    auVar181._0_4_ = fVar216 * auVar48._0_4_;
    auVar181._4_4_ = fVar226 * auVar48._4_4_;
    auVar181._8_4_ = fVar227 * auVar48._8_4_;
    auVar181._12_4_ = fVar228 * auVar48._12_4_;
    auVar259._0_4_ = auVar49._0_4_ * fVar216;
    auVar259._4_4_ = auVar49._4_4_ * fVar226;
    auVar259._8_4_ = auVar49._8_4_ * fVar227;
    auVar259._12_4_ = auVar49._12_4_ * fVar228;
    auVar159._0_4_ = fVar216 * auVar61._0_4_;
    auVar159._4_4_ = fVar226 * auVar61._4_4_;
    auVar159._8_4_ = fVar227 * auVar61._8_4_;
    auVar159._12_4_ = fVar228 * auVar61._12_4_;
    auVar60 = vfmadd231ps_fma(auVar174,auVar63,auVar132);
    auVar61 = vfmadd231ps_fma(auVar181,auVar63,auVar219);
    auVar62 = vfmadd231ps_fma(auVar259,auVar63,auVar237);
    auVar63 = vfmadd231ps_fma(auVar159,auVar63,ZEXT816(0));
    auVar49 = vsubss_avx512f(auVar42,auVar57);
    auVar48 = vmovshdup_avx(auVar41);
    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar57._0_4_)),auVar41,auVar49);
    auVar49 = vsubss_avx512f(auVar42,auVar43);
    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar43._0_4_)),auVar41,auVar49);
    auVar40 = vdivss_avx512f(auVar42,ZEXT416((uint)fVar231));
    auVar48 = vsubps_avx(auVar61,auVar60);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar54 = vmulps_avx512vl(auVar48,auVar41);
    auVar48 = vsubps_avx(auVar62,auVar61);
    auVar57 = vmulps_avx512vl(auVar48,auVar41);
    auVar48 = vsubps_avx(auVar63,auVar62);
    auVar48 = vmulps_avx512vl(auVar48,auVar41);
    auVar49 = vminps_avx(auVar57,auVar48);
    auVar48 = vmaxps_avx(auVar57,auVar48);
    auVar49 = vminps_avx(auVar54,auVar49);
    auVar48 = vmaxps_avx(auVar54,auVar48);
    auVar54 = vshufpd_avx(auVar49,auVar49,3);
    auVar57 = vshufpd_avx(auVar48,auVar48,3);
    auVar49 = vminps_avx(auVar49,auVar54);
    auVar48 = vmaxps_avx(auVar48,auVar57);
    fVar231 = auVar40._0_4_;
    auVar204._0_4_ = auVar49._0_4_ * fVar231;
    auVar204._4_4_ = auVar49._4_4_ * fVar231;
    auVar204._8_4_ = auVar49._8_4_ * fVar231;
    auVar204._12_4_ = auVar49._12_4_ * fVar231;
    auVar192._0_4_ = fVar231 * auVar48._0_4_;
    auVar192._4_4_ = fVar231 * auVar48._4_4_;
    auVar192._8_4_ = fVar231 * auVar48._8_4_;
    auVar192._12_4_ = fVar231 * auVar48._12_4_;
    auVar40 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar65._0_4_ - auVar44._0_4_)));
    auVar48 = vshufpd_avx(auVar60,auVar60,3);
    auVar49 = vshufpd_avx(auVar61,auVar61,3);
    auVar54 = vshufpd_avx(auVar62,auVar62,3);
    auVar57 = vshufpd_avx(auVar63,auVar63,3);
    auVar48 = vsubps_avx(auVar48,auVar60);
    auVar60 = vsubps_avx(auVar49,auVar61);
    auVar61 = vsubps_avx(auVar54,auVar62);
    auVar57 = vsubps_avx(auVar57,auVar63);
    auVar49 = vminps_avx(auVar48,auVar60);
    auVar48 = vmaxps_avx(auVar48,auVar60);
    auVar54 = vminps_avx(auVar61,auVar57);
    auVar54 = vminps_avx(auVar49,auVar54);
    auVar49 = vmaxps_avx(auVar61,auVar57);
    auVar48 = vmaxps_avx(auVar48,auVar49);
    fVar231 = auVar40._0_4_;
    auVar238._0_4_ = fVar231 * auVar54._0_4_;
    auVar238._4_4_ = fVar231 * auVar54._4_4_;
    auVar238._8_4_ = fVar231 * auVar54._8_4_;
    auVar238._12_4_ = fVar231 * auVar54._12_4_;
    auVar220._0_4_ = fVar231 * auVar48._0_4_;
    auVar220._4_4_ = fVar231 * auVar48._4_4_;
    auVar220._8_4_ = fVar231 * auVar48._8_4_;
    auVar220._12_4_ = fVar231 * auVar48._12_4_;
    auVar57 = vinsertps_avx(auVar55,auVar44,0x10);
    auVar66 = vpermt2ps_avx512vl(auVar55,_DAT_01fb9f90,auVar65);
    auVar116._0_4_ = auVar57._0_4_ + auVar66._0_4_;
    auVar116._4_4_ = auVar57._4_4_ + auVar66._4_4_;
    auVar116._8_4_ = auVar57._8_4_ + auVar66._8_4_;
    auVar116._12_4_ = auVar57._12_4_ + auVar66._12_4_;
    auVar40 = vmulps_avx512vl(auVar116,auVar271._0_16_);
    auVar49 = vshufps_avx(auVar40,auVar40,0x54);
    uVar102 = auVar40._0_4_;
    auVar119._4_4_ = uVar102;
    auVar119._0_4_ = uVar102;
    auVar119._8_4_ = uVar102;
    auVar119._12_4_ = uVar102;
    auVar54 = vfmadd213ps_fma(local_270,auVar119,auVar59);
    auVar60 = vfmadd213ps_fma(local_280,auVar119,auVar56);
    auVar61 = vfmadd213ps_fma(local_290,auVar119,auVar64);
    auVar48 = vsubps_avx(auVar60,auVar54);
    auVar54 = vfmadd213ps_fma(auVar48,auVar119,auVar54);
    auVar48 = vsubps_avx(auVar61,auVar60);
    auVar48 = vfmadd213ps_fma(auVar48,auVar119,auVar60);
    auVar48 = vsubps_avx(auVar48,auVar54);
    auVar54 = vfmadd231ps_fma(auVar54,auVar48,auVar119);
    auVar62 = vmulps_avx512vl(auVar48,auVar41);
    auVar246._8_8_ = auVar54._0_8_;
    auVar246._0_8_ = auVar54._0_8_;
    auVar48 = vshufpd_avx(auVar54,auVar54,3);
    auVar54 = vshufps_avx(auVar40,auVar40,0x55);
    auVar60 = vsubps_avx(auVar48,auVar246);
    auVar61 = vfmadd231ps_fma(auVar246,auVar54,auVar60);
    auVar260._8_8_ = auVar62._0_8_;
    auVar260._0_8_ = auVar62._0_8_;
    auVar48 = vshufpd_avx(auVar62,auVar62,3);
    auVar48 = vsubps_avx512vl(auVar48,auVar260);
    auVar48 = vfmadd213ps_avx512vl(auVar48,auVar54,auVar260);
    auVar120._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar60._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar60._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar48);
    auVar261._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    auVar261._8_4_ = auVar54._8_4_ ^ 0x80000000;
    auVar261._12_4_ = auVar54._12_4_ ^ 0x80000000;
    auVar62 = vmovshdup_avx512vl(auVar60);
    auVar63 = vpermt2ps_avx512vl(auVar261,ZEXT416(5),auVar60);
    auVar54 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar60._0_4_)),auVar48,auVar62);
    auVar60 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar120);
    auVar160._0_4_ = auVar54._0_4_;
    auVar160._4_4_ = auVar160._0_4_;
    auVar160._8_4_ = auVar160._0_4_;
    auVar160._12_4_ = auVar160._0_4_;
    auVar48 = vdivps_avx(auVar63,auVar160);
    auVar67 = vdivps_avx512vl(auVar60,auVar160);
    fVar231 = auVar61._0_4_;
    auVar54 = vshufps_avx(auVar61,auVar61,0x55);
    auVar247._0_4_ = fVar231 * auVar48._0_4_ + auVar54._0_4_ * auVar67._0_4_;
    auVar247._4_4_ = fVar231 * auVar48._4_4_ + auVar54._4_4_ * auVar67._4_4_;
    auVar247._8_4_ = fVar231 * auVar48._8_4_ + auVar54._8_4_ * auVar67._8_4_;
    auVar247._12_4_ = fVar231 * auVar48._12_4_ + auVar54._12_4_ * auVar67._12_4_;
    auVar41 = vsubps_avx(auVar49,auVar247);
    auVar54 = vmovshdup_avx(auVar48);
    auVar49 = vinsertps_avx(auVar204,auVar238,0x1c);
    auVar262._0_4_ = auVar54._0_4_ * auVar49._0_4_;
    auVar262._4_4_ = auVar54._4_4_ * auVar49._4_4_;
    auVar262._8_4_ = auVar54._8_4_ * auVar49._8_4_;
    auVar262._12_4_ = auVar54._12_4_ * auVar49._12_4_;
    auVar43 = vinsertps_avx512f(auVar192,auVar220,0x1c);
    auVar54 = vmulps_avx512vl(auVar54,auVar43);
    auVar63 = vminps_avx512vl(auVar262,auVar54);
    auVar61 = vmaxps_avx(auVar54,auVar262);
    auVar62 = vmovshdup_avx(auVar67);
    auVar54 = vinsertps_avx(auVar238,auVar204,0x4c);
    auVar239._0_4_ = auVar62._0_4_ * auVar54._0_4_;
    auVar239._4_4_ = auVar62._4_4_ * auVar54._4_4_;
    auVar239._8_4_ = auVar62._8_4_ * auVar54._8_4_;
    auVar239._12_4_ = auVar62._12_4_ * auVar54._12_4_;
    auVar60 = vinsertps_avx(auVar220,auVar192,0x4c);
    auVar221._0_4_ = auVar62._0_4_ * auVar60._0_4_;
    auVar221._4_4_ = auVar62._4_4_ * auVar60._4_4_;
    auVar221._8_4_ = auVar62._8_4_ * auVar60._8_4_;
    auVar221._12_4_ = auVar62._12_4_ * auVar60._12_4_;
    auVar62 = vminps_avx(auVar239,auVar221);
    auVar63 = vaddps_avx512vl(auVar63,auVar62);
    auVar62 = vmaxps_avx(auVar221,auVar239);
    auVar222._0_4_ = auVar61._0_4_ + auVar62._0_4_;
    auVar222._4_4_ = auVar61._4_4_ + auVar62._4_4_;
    auVar222._8_4_ = auVar61._8_4_ + auVar62._8_4_;
    auVar222._12_4_ = auVar61._12_4_ + auVar62._12_4_;
    auVar240._8_8_ = 0x3f80000000000000;
    auVar240._0_8_ = 0x3f80000000000000;
    auVar61 = vsubps_avx(auVar240,auVar222);
    auVar62 = vsubps_avx(auVar240,auVar63);
    auVar63 = vsubps_avx(auVar57,auVar40);
    auVar40 = vsubps_avx(auVar66,auVar40);
    fVar228 = auVar63._0_4_;
    auVar263._0_4_ = fVar228 * auVar61._0_4_;
    fVar229 = auVar63._4_4_;
    auVar263._4_4_ = fVar229 * auVar61._4_4_;
    fVar230 = auVar63._8_4_;
    auVar263._8_4_ = fVar230 * auVar61._8_4_;
    fVar185 = auVar63._12_4_;
    auVar263._12_4_ = fVar185 * auVar61._12_4_;
    auVar68 = vbroadcastss_avx512vl(auVar48);
    auVar49 = vmulps_avx512vl(auVar68,auVar49);
    auVar43 = vmulps_avx512vl(auVar68,auVar43);
    auVar68 = vminps_avx512vl(auVar49,auVar43);
    auVar43 = vmaxps_avx512vl(auVar43,auVar49);
    auVar49 = vbroadcastss_avx512vl(auVar67);
    auVar54 = vmulps_avx512vl(auVar49,auVar54);
    auVar49 = vmulps_avx512vl(auVar49,auVar60);
    auVar60 = vminps_avx512vl(auVar54,auVar49);
    auVar60 = vaddps_avx512vl(auVar68,auVar60);
    auVar63 = vmulps_avx512vl(auVar63,auVar62);
    fVar231 = auVar40._0_4_;
    auVar223._0_4_ = fVar231 * auVar61._0_4_;
    fVar216 = auVar40._4_4_;
    auVar223._4_4_ = fVar216 * auVar61._4_4_;
    fVar226 = auVar40._8_4_;
    auVar223._8_4_ = fVar226 * auVar61._8_4_;
    fVar227 = auVar40._12_4_;
    auVar223._12_4_ = fVar227 * auVar61._12_4_;
    auVar241._0_4_ = fVar231 * auVar62._0_4_;
    auVar241._4_4_ = fVar216 * auVar62._4_4_;
    auVar241._8_4_ = fVar226 * auVar62._8_4_;
    auVar241._12_4_ = fVar227 * auVar62._12_4_;
    auVar49 = vmaxps_avx(auVar49,auVar54);
    auVar193._0_4_ = auVar43._0_4_ + auVar49._0_4_;
    auVar193._4_4_ = auVar43._4_4_ + auVar49._4_4_;
    auVar193._8_4_ = auVar43._8_4_ + auVar49._8_4_;
    auVar193._12_4_ = auVar43._12_4_ + auVar49._12_4_;
    auVar205._8_8_ = 0x3f800000;
    auVar205._0_8_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar205,auVar193);
    auVar54 = vsubps_avx512vl(auVar205,auVar60);
    auVar253._0_4_ = fVar228 * auVar49._0_4_;
    auVar253._4_4_ = fVar229 * auVar49._4_4_;
    auVar253._8_4_ = fVar230 * auVar49._8_4_;
    auVar253._12_4_ = fVar185 * auVar49._12_4_;
    auVar248._0_4_ = fVar228 * auVar54._0_4_;
    auVar248._4_4_ = fVar229 * auVar54._4_4_;
    auVar248._8_4_ = fVar230 * auVar54._8_4_;
    auVar248._12_4_ = fVar185 * auVar54._12_4_;
    auVar194._0_4_ = fVar231 * auVar49._0_4_;
    auVar194._4_4_ = fVar216 * auVar49._4_4_;
    auVar194._8_4_ = fVar226 * auVar49._8_4_;
    auVar194._12_4_ = fVar227 * auVar49._12_4_;
    auVar206._0_4_ = fVar231 * auVar54._0_4_;
    auVar206._4_4_ = fVar216 * auVar54._4_4_;
    auVar206._8_4_ = fVar226 * auVar54._8_4_;
    auVar206._12_4_ = fVar227 * auVar54._12_4_;
    auVar49 = vminps_avx(auVar253,auVar248);
    auVar54 = vminps_avx512vl(auVar194,auVar206);
    auVar60 = vminps_avx512vl(auVar49,auVar54);
    auVar49 = vmaxps_avx(auVar248,auVar253);
    auVar54 = vmaxps_avx(auVar206,auVar194);
    auVar54 = vmaxps_avx(auVar54,auVar49);
    auVar61 = vminps_avx512vl(auVar263,auVar63);
    auVar49 = vminps_avx(auVar223,auVar241);
    auVar49 = vminps_avx(auVar61,auVar49);
    auVar49 = vhaddps_avx(auVar60,auVar49);
    auVar61 = vmaxps_avx512vl(auVar63,auVar263);
    auVar60 = vmaxps_avx(auVar241,auVar223);
    auVar60 = vmaxps_avx(auVar60,auVar61);
    auVar54 = vhaddps_avx(auVar54,auVar60);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
    auVar195._0_4_ = auVar49._0_4_ + auVar41._0_4_;
    auVar195._4_4_ = auVar49._4_4_ + auVar41._4_4_;
    auVar195._8_4_ = auVar49._8_4_ + auVar41._8_4_;
    auVar195._12_4_ = auVar49._12_4_ + auVar41._12_4_;
    auVar207._0_4_ = auVar54._0_4_ + auVar41._0_4_;
    auVar207._4_4_ = auVar54._4_4_ + auVar41._4_4_;
    auVar207._8_4_ = auVar54._8_4_ + auVar41._8_4_;
    auVar207._12_4_ = auVar54._12_4_ + auVar41._12_4_;
    auVar49 = vmaxps_avx(auVar57,auVar195);
    auVar54 = vminps_avx(auVar207,auVar66);
    uVar3 = vcmpps_avx512vl(auVar54,auVar49,1);
  } while ((uVar3 & 3) != 0);
  uVar3 = vcmpps_avx512vl(auVar207,auVar66,1);
  uVar18 = vcmpps_avx512vl(auVar55,auVar195,1);
  if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
    bVar26 = 0;
  }
  else {
    auVar49 = vmovshdup_avx(auVar195);
    bVar26 = auVar44._0_4_ < auVar49._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar28 || uVar7 != 0 && !bVar38) | bVar26) != 1) goto LAB_018fd695;
  lVar31 = 0xc9;
  do {
    lVar31 = lVar31 + -1;
    if (lVar31 == 0) goto LAB_018fc815;
    auVar55 = vsubss_avx512f(auVar42,auVar41);
    fVar226 = auVar55._0_4_;
    fVar231 = fVar226 * fVar226 * fVar226;
    auVar55 = vmulss_avx512f(auVar41,ZEXT416(0x40400000));
    fVar216 = auVar55._0_4_ * fVar226 * fVar226;
    fVar227 = auVar41._0_4_;
    auVar55 = vmulss_avx512f(ZEXT416((uint)(fVar227 * fVar227)),ZEXT416(0x40400000));
    fVar226 = fVar226 * auVar55._0_4_;
    auVar141._4_4_ = fVar231;
    auVar141._0_4_ = fVar231;
    auVar141._8_4_ = fVar231;
    auVar141._12_4_ = fVar231;
    auVar133._4_4_ = fVar216;
    auVar133._0_4_ = fVar216;
    auVar133._8_4_ = fVar216;
    auVar133._12_4_ = fVar216;
    auVar106._4_4_ = fVar226;
    auVar106._0_4_ = fVar226;
    auVar106._8_4_ = fVar226;
    auVar106._12_4_ = fVar226;
    fVar227 = fVar227 * fVar227 * fVar227;
    auVar175._0_4_ = (float)local_2a0._0_4_ * fVar227;
    auVar175._4_4_ = (float)local_2a0._4_4_ * fVar227;
    auVar175._8_4_ = fStack_298 * fVar227;
    auVar175._12_4_ = fStack_294 * fVar227;
    auVar55 = vfmadd231ps_fma(auVar175,auVar64,auVar106);
    auVar55 = vfmadd231ps_fma(auVar55,auVar56,auVar133);
    auVar55 = vfmadd231ps_fma(auVar55,auVar59,auVar141);
    auVar107._8_8_ = auVar55._0_8_;
    auVar107._0_8_ = auVar55._0_8_;
    auVar55 = vshufpd_avx(auVar55,auVar55,3);
    auVar49 = vshufps_avx(auVar41,auVar41,0x55);
    auVar55 = vsubps_avx(auVar55,auVar107);
    auVar49 = vfmadd213ps_fma(auVar55,auVar49,auVar107);
    fVar231 = auVar49._0_4_;
    auVar55 = vshufps_avx(auVar49,auVar49,0x55);
    auVar108._0_4_ = auVar48._0_4_ * fVar231 + auVar67._0_4_ * auVar55._0_4_;
    auVar108._4_4_ = auVar48._4_4_ * fVar231 + auVar67._4_4_ * auVar55._4_4_;
    auVar108._8_4_ = auVar48._8_4_ * fVar231 + auVar67._8_4_ * auVar55._8_4_;
    auVar108._12_4_ = auVar48._12_4_ * fVar231 + auVar67._12_4_ * auVar55._12_4_;
    auVar41 = vsubps_avx(auVar41,auVar108);
    auVar55 = vandps_avx512vl(auVar49,auVar268._0_16_);
    auVar49 = vprolq_avx512vl(auVar55,0x20);
    auVar55 = vmaxss_avx(auVar49,auVar55);
    bVar38 = (float)local_2b0._0_4_ < auVar55._0_4_;
  } while ((float)local_2b0._0_4_ <= auVar55._0_4_);
  auVar55 = vucomiss_avx512f(auVar45);
  if (bVar38) goto LAB_018fc815;
  auVar48 = vucomiss_avx512f(auVar55);
  auVar270 = ZEXT1664(auVar48);
  if (bVar38) goto LAB_018fc815;
  vmovshdup_avx(auVar55);
  auVar48 = vucomiss_avx512f(auVar45);
  if (bVar38) goto LAB_018fc815;
  auVar49 = vucomiss_avx512f(auVar48);
  auVar270 = ZEXT1664(auVar49);
  if (bVar38) goto LAB_018fc815;
  auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar41 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar54 = vdpps_avx(auVar41,local_2c0,0x7f);
  auVar57 = vdpps_avx(auVar41,local_2d0,0x7f);
  auVar60 = vdpps_avx(auVar41,local_2e0,0x7f);
  auVar61 = vdpps_avx(auVar41,local_2f0,0x7f);
  auVar62 = vdpps_avx(auVar41,local_300,0x7f);
  auVar63 = vdpps_avx(auVar41,local_310,0x7f);
  auVar40 = vdpps_avx(auVar41,local_320,0x7f);
  auVar41 = vdpps_avx(auVar41,local_330,0x7f);
  auVar42 = vsubss_avx512f(auVar49,auVar48);
  fVar231 = auVar48._0_4_;
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar62._0_4_)),auVar42,auVar54);
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar231)),auVar42,auVar57);
  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar231)),auVar42,auVar60);
  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar41._0_4_)),auVar42,auVar61);
  auVar49 = vsubss_avx512f(auVar49,auVar55);
  auVar176._0_4_ = auVar49._0_4_;
  fVar231 = auVar176._0_4_ * auVar176._0_4_ * auVar176._0_4_;
  auVar49 = vmulss_avx512f(auVar55,ZEXT416(0x40400000));
  fVar216 = auVar49._0_4_ * auVar176._0_4_ * auVar176._0_4_;
  local_120 = auVar55._0_4_;
  auVar161._0_4_ = local_120 * local_120;
  auVar161._4_4_ = auVar55._4_4_ * auVar55._4_4_;
  auVar161._8_4_ = auVar55._8_4_ * auVar55._8_4_;
  auVar161._12_4_ = auVar55._12_4_ * auVar55._12_4_;
  auVar49 = vmulss_avx512f(auVar161,ZEXT416(0x40400000));
  fVar226 = auVar176._0_4_ * auVar49._0_4_;
  fVar228 = local_120 * auVar161._0_4_;
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar60._0_4_)),ZEXT416((uint)fVar226),auVar57)
  ;
  auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar216),auVar54);
  auVar48 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar231),auVar48);
  fVar227 = auVar48._0_4_;
  if ((fVar227 < fVar147) || (fVar229 = *(float *)(ray + k * 4 + 0x100), fVar229 < fVar227))
  goto LAB_018fc815;
  auVar48 = vshufps_avx(auVar55,auVar55,0x55);
  auVar54 = vsubps_avx512vl(auVar47,auVar48);
  fVar230 = auVar48._0_4_;
  auVar208._0_4_ = fVar230 * (float)local_380._0_4_;
  fVar185 = auVar48._4_4_;
  auVar208._4_4_ = fVar185 * (float)local_380._4_4_;
  fVar186 = auVar48._8_4_;
  auVar208._8_4_ = fVar186 * fStack_378;
  fVar187 = auVar48._12_4_;
  auVar208._12_4_ = fVar187 * fStack_374;
  auVar213._0_4_ = fVar230 * (float)local_390._0_4_;
  auVar213._4_4_ = fVar185 * (float)local_390._4_4_;
  auVar213._8_4_ = fVar186 * fStack_388;
  auVar213._12_4_ = fVar187 * fStack_384;
  auVar224._0_4_ = fVar230 * (float)local_3a0._0_4_;
  auVar224._4_4_ = fVar185 * (float)local_3a0._4_4_;
  auVar224._8_4_ = fVar186 * fStack_398;
  auVar224._12_4_ = fVar187 * fStack_394;
  auVar182._0_4_ = fVar230 * (float)local_3b0._0_4_;
  auVar182._4_4_ = fVar185 * (float)local_3b0._4_4_;
  auVar182._8_4_ = fVar186 * fStack_3a8;
  auVar182._12_4_ = fVar187 * fStack_3a4;
  auVar47 = vfmadd231ps_fma(auVar208,auVar54,local_340);
  auVar48 = vfmadd231ps_fma(auVar213,auVar54,local_350);
  auVar49 = vfmadd231ps_fma(auVar224,auVar54,local_360);
  auVar54 = vfmadd231ps_fma(auVar182,auVar54,local_370);
  auVar47 = vsubps_avx(auVar48,auVar47);
  auVar48 = vsubps_avx(auVar49,auVar48);
  auVar49 = vsubps_avx(auVar54,auVar49);
  auVar225._0_4_ = local_120 * auVar48._0_4_;
  auVar225._4_4_ = local_120 * auVar48._4_4_;
  auVar225._8_4_ = local_120 * auVar48._8_4_;
  auVar225._12_4_ = local_120 * auVar48._12_4_;
  auVar176._4_4_ = auVar176._0_4_;
  auVar176._8_4_ = auVar176._0_4_;
  auVar176._12_4_ = auVar176._0_4_;
  auVar47 = vfmadd231ps_fma(auVar225,auVar176,auVar47);
  auVar183._0_4_ = local_120 * auVar49._0_4_;
  auVar183._4_4_ = local_120 * auVar49._4_4_;
  auVar183._8_4_ = local_120 * auVar49._8_4_;
  auVar183._12_4_ = local_120 * auVar49._12_4_;
  auVar48 = vfmadd231ps_fma(auVar183,auVar176,auVar48);
  auVar184._0_4_ = local_120 * auVar48._0_4_;
  auVar184._4_4_ = local_120 * auVar48._4_4_;
  auVar184._8_4_ = local_120 * auVar48._8_4_;
  auVar184._12_4_ = local_120 * auVar48._12_4_;
  auVar47 = vfmadd231ps_fma(auVar184,auVar176,auVar47);
  auVar22._8_4_ = 0x40400000;
  auVar22._0_8_ = 0x4040000040400000;
  auVar22._12_4_ = 0x40400000;
  auVar47 = vmulps_avx512vl(auVar47,auVar22);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar26 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018fd68d;
    auVar162._0_4_ = fVar228 * (float)local_400._0_4_;
    auVar162._4_4_ = fVar228 * (float)local_400._4_4_;
    auVar162._8_4_ = fVar228 * fStack_3f8;
    auVar162._12_4_ = fVar228 * fStack_3f4;
    auVar142._4_4_ = fVar226;
    auVar142._0_4_ = fVar226;
    auVar142._8_4_ = fVar226;
    auVar142._12_4_ = fVar226;
    auVar48 = vfmadd132ps_fma(auVar142,auVar162,local_3f0);
    auVar134._4_4_ = fVar216;
    auVar134._0_4_ = fVar216;
    auVar134._8_4_ = fVar216;
    auVar134._12_4_ = fVar216;
    auVar48 = vfmadd132ps_fma(auVar134,auVar48,local_3e0);
    auVar121._4_4_ = fVar231;
    auVar121._0_4_ = fVar231;
    auVar121._8_4_ = fVar231;
    auVar121._12_4_ = fVar231;
    auVar54 = vfmadd132ps_fma(auVar121,auVar48,local_3d0);
    auVar48 = vshufps_avx(auVar54,auVar54,0xc9);
    auVar49 = vshufps_avx(auVar47,auVar47,0xc9);
    auVar122._0_4_ = auVar54._0_4_ * auVar49._0_4_;
    auVar122._4_4_ = auVar54._4_4_ * auVar49._4_4_;
    auVar122._8_4_ = auVar54._8_4_ * auVar49._8_4_;
    auVar122._12_4_ = auVar54._12_4_ * auVar49._12_4_;
    auVar47 = vfmsub231ps_fma(auVar122,auVar47,auVar48);
    auVar145._8_4_ = 1;
    auVar145._0_8_ = 0x100000001;
    auVar145._12_4_ = 1;
    auVar145._16_4_ = 1;
    auVar145._20_4_ = 1;
    auVar145._24_4_ = 1;
    auVar145._28_4_ = 1;
    local_100 = vpermps_avx2(auVar145,ZEXT1632(auVar55));
    auVar87 = vpermps_avx2(auVar145,ZEXT1632(auVar47));
    auVar166._8_4_ = 2;
    auVar166._0_8_ = 0x200000002;
    auVar166._12_4_ = 2;
    auVar166._16_4_ = 2;
    auVar166._20_4_ = 2;
    auVar166._24_4_ = 2;
    auVar166._28_4_ = 2;
    local_160 = vpermps_avx2(auVar166,ZEXT1632(auVar47));
    local_140 = auVar47._0_4_;
    local_180[0] = (RTCHitN)auVar87[0];
    local_180[1] = (RTCHitN)auVar87[1];
    local_180[2] = (RTCHitN)auVar87[2];
    local_180[3] = (RTCHitN)auVar87[3];
    local_180[4] = (RTCHitN)auVar87[4];
    local_180[5] = (RTCHitN)auVar87[5];
    local_180[6] = (RTCHitN)auVar87[6];
    local_180[7] = (RTCHitN)auVar87[7];
    local_180[8] = (RTCHitN)auVar87[8];
    local_180[9] = (RTCHitN)auVar87[9];
    local_180[10] = (RTCHitN)auVar87[10];
    local_180[0xb] = (RTCHitN)auVar87[0xb];
    local_180[0xc] = (RTCHitN)auVar87[0xc];
    local_180[0xd] = (RTCHitN)auVar87[0xd];
    local_180[0xe] = (RTCHitN)auVar87[0xe];
    local_180[0xf] = (RTCHitN)auVar87[0xf];
    local_180[0x10] = (RTCHitN)auVar87[0x10];
    local_180[0x11] = (RTCHitN)auVar87[0x11];
    local_180[0x12] = (RTCHitN)auVar87[0x12];
    local_180[0x13] = (RTCHitN)auVar87[0x13];
    local_180[0x14] = (RTCHitN)auVar87[0x14];
    local_180[0x15] = (RTCHitN)auVar87[0x15];
    local_180[0x16] = (RTCHitN)auVar87[0x16];
    local_180[0x17] = (RTCHitN)auVar87[0x17];
    local_180[0x18] = (RTCHitN)auVar87[0x18];
    local_180[0x19] = (RTCHitN)auVar87[0x19];
    local_180[0x1a] = (RTCHitN)auVar87[0x1a];
    local_180[0x1b] = (RTCHitN)auVar87[0x1b];
    local_180[0x1c] = (RTCHitN)auVar87[0x1c];
    local_180[0x1d] = (RTCHitN)auVar87[0x1d];
    local_180[0x1e] = (RTCHitN)auVar87[0x1e];
    local_180[0x1f] = (RTCHitN)auVar87[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar227;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar8->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_450);
      auVar267 = ZEXT3264(_DAT_01fb9fe0);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar266 = ZEXT1664(auVar55);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar265 = ZEXT3264(auVar87);
      auVar270 = ZEXT464(0x3f800000);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar271 = ZEXT1664(auVar55);
      auVar55 = vxorps_avx512vl(auVar45,auVar45);
      auVar264 = ZEXT1664(auVar55);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar269 = ZEXT1664(auVar55);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar268 = ZEXT1664(auVar55);
    }
    auVar55 = auVar264._0_16_;
    if (local_420 != (undefined1  [32])0x0) {
      p_Var13 = context->args->filter;
      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var13)(&local_450);
        auVar267 = ZEXT3264(_DAT_01fb9fe0);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar266 = ZEXT1664(auVar45);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar265 = ZEXT3264(auVar87);
        auVar270 = ZEXT464(0x3f800000);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar271 = ZEXT1664(auVar45);
        auVar55 = vxorps_avx512vl(auVar55,auVar55);
        auVar264 = ZEXT1664(auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar269 = ZEXT1664(auVar55);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar268 = ZEXT1664(auVar55);
      }
      uVar3 = vptestmd_avx512vl(local_420,local_420);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar38 = (bool)((byte)uVar3 & 1);
      bVar39 = (bool)((byte)(uVar3 >> 1) & 1);
      bVar36 = (bool)((byte)(uVar3 >> 2) & 1);
      bVar37 = (bool)((byte)(uVar3 >> 3) & 1);
      bVar14 = (bool)((byte)(uVar3 >> 4) & 1);
      bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
      bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
      bVar17 = SUB81(uVar3 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar38 * auVar87._0_4_ | (uint)!bVar38 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar39 * auVar87._4_4_ | (uint)!bVar39 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar36 * auVar87._8_4_ | (uint)!bVar36 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar37 * auVar87._12_4_ | (uint)!bVar37 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar14 * auVar87._16_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar15 * auVar87._20_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar16 * auVar87._24_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar17 * auVar87._28_4_ | (uint)!bVar17 * *(int *)(local_450.ray + 0x11c);
      bVar26 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_018fd68d;
    }
    *(float *)(ray + k * 4 + 0x100) = fVar229;
  }
  bVar26 = 0;
LAB_018fd68d:
  bVar35 = (bool)(bVar35 | bVar26);
  goto LAB_018fc815;
LAB_018fd695:
  auVar41 = vinsertps_avx(auVar44,auVar65,0x10);
  goto LAB_018fc319;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }